

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O1

bool embree::avx::CurveNiIntersector1<8>::
     occluded_n<embree::avx::OrientedCurve1Intersector1<embree::BSplineCurveT,7,8>,embree::avx::Occluded1Epilog1<true>>
               (Precalculations *pre,Ray *ray,RayQueryContext *context,Primitive *prim)

{
  float *pfVar1;
  undefined4 uVar2;
  undefined8 uVar3;
  ulong uVar4;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  Primitive PVar8;
  Geometry *pGVar9;
  RTCFilterFunctionN p_Var10;
  void *pvVar11;
  __int_type_conflict _Var12;
  long lVar13;
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [16];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  bool bVar61;
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  byte bVar67;
  uint uVar68;
  uint uVar69;
  long lVar71;
  ulong uVar72;
  ulong uVar73;
  ulong uVar74;
  float t1;
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  float fVar130;
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  float fVar153;
  float fVar155;
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  float fVar152;
  float fVar154;
  float fVar157;
  float fVar158;
  float fVar159;
  undefined1 auVar144 [32];
  undefined1 auVar145 [32];
  float fVar156;
  undefined1 auVar146 [32];
  undefined1 auVar147 [32];
  undefined1 auVar148 [32];
  undefined1 auVar149 [32];
  undefined1 auVar150 [32];
  float fVar160;
  float fVar179;
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  float fVar176;
  float fVar178;
  float fVar181;
  float fVar182;
  float fVar183;
  undefined1 auVar172 [32];
  undefined1 auVar173 [32];
  float fVar177;
  float fVar180;
  undefined1 auVar174 [32];
  undefined1 auVar175 [32];
  float fVar184;
  float fVar200;
  float fVar201;
  undefined1 auVar185 [16];
  float fVar202;
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  float fVar203;
  float fVar204;
  float fVar205;
  undefined1 auVar199 [32];
  float fVar220;
  vfloat4 b0;
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  float fVar222;
  undefined1 auVar216 [32];
  undefined1 auVar217 [32];
  undefined1 auVar211 [16];
  undefined1 auVar218 [32];
  float fVar221;
  undefined1 auVar219 [32];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [32];
  undefined1 auVar233 [32];
  undefined1 auVar234 [32];
  undefined1 auVar235 [32];
  undefined1 auVar236 [32];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  undefined1 auVar250 [16];
  undefined1 auVar251 [32];
  undefined1 auVar252 [32];
  undefined1 auVar253 [32];
  undefined1 auVar254 [32];
  undefined1 auVar255 [16];
  undefined1 auVar257 [16];
  undefined1 auVar258 [16];
  undefined1 auVar259 [16];
  undefined1 auVar260 [16];
  undefined1 auVar261 [16];
  undefined1 auVar262 [16];
  undefined1 auVar263 [16];
  undefined1 auVar264 [16];
  undefined1 auVar256 [16];
  undefined1 auVar265 [32];
  undefined1 auVar266 [32];
  vfloat4 a0;
  undefined1 auVar267 [16];
  undefined1 auVar268 [16];
  undefined1 auVar269 [16];
  undefined1 auVar270 [16];
  undefined1 auVar272 [16];
  undefined1 auVar273 [16];
  undefined1 auVar274 [16];
  undefined1 auVar275 [16];
  undefined1 auVar271 [16];
  undefined1 auVar276 [32];
  undefined1 auVar277 [32];
  undefined1 auVar278 [32];
  float fVar287;
  float fVar288;
  vfloat4 a0_1;
  undefined1 auVar279 [16];
  float fVar289;
  undefined1 auVar280 [16];
  undefined1 auVar281 [16];
  undefined1 auVar282 [16];
  undefined1 auVar283 [16];
  undefined1 auVar284 [16];
  float fVar290;
  float fVar291;
  float fVar292;
  undefined1 auVar285 [32];
  undefined1 auVar286 [32];
  undefined1 auVar294 [16];
  undefined1 auVar295 [16];
  float fVar293;
  float fVar300;
  undefined1 auVar296 [16];
  float fVar298;
  float fVar299;
  float fVar301;
  float fVar302;
  float fVar303;
  float fVar304;
  float fVar305;
  float fVar306;
  float in_register_0000151c;
  undefined1 auVar297 [32];
  float fVar307;
  undefined1 auVar308 [16];
  undefined1 auVar309 [16];
  undefined1 auVar310 [16];
  undefined1 auVar311 [16];
  undefined1 auVar312 [32];
  float fVar314;
  float fVar315;
  undefined1 auVar313 [32];
  float fVar316;
  undefined1 auVar317 [16];
  float fVar320;
  float fVar321;
  float in_register_0000159c;
  undefined1 auVar318 [32];
  undefined1 auVar319 [64];
  undefined1 auVar322 [16];
  undefined1 auVar323 [16];
  undefined1 auVar324 [16];
  undefined1 auVar325 [16];
  undefined1 auVar326 [16];
  undefined1 auVar327 [16];
  float in_register_000015dc;
  undefined1 auVar329 [64];
  vfloat_impl<4> p03;
  vfloat_impl<4> p02;
  vfloat_impl<4> p01;
  vfloat_impl<4> p00;
  RTCFilterFunctionNArguments args;
  uint mask_stack [4];
  BBox1f cu_stack [4];
  BBox1f cv_stack [4];
  bool local_4d9;
  undefined1 local_498 [16];
  int local_47c;
  undefined1 local_478 [8];
  float fStack_470;
  float fStack_46c;
  undefined1 auStack_468 [16];
  undefined1 local_458 [8];
  float fStack_450;
  float fStack_44c;
  undefined1 local_448 [8];
  float fStack_440;
  float fStack_43c;
  ulong local_430;
  float local_428;
  float fStack_424;
  float fStack_420;
  float fStack_41c;
  undefined1 local_418 [8];
  float fStack_410;
  float fStack_40c;
  undefined1 auStack_408 [16];
  undefined1 local_3f8 [32];
  undefined1 local_3d8 [8];
  float fStack_3d0;
  float fStack_3cc;
  float fStack_3c8;
  float fStack_3c4;
  float fStack_3c0;
  undefined1 local_3b8 [8];
  float fStack_3b0;
  float fStack_3ac;
  undefined1 local_3a8 [8];
  float fStack_3a0;
  float fStack_39c;
  undefined1 local_398 [8];
  float fStack_390;
  float fStack_38c;
  undefined1 local_388 [8];
  float fStack_380;
  float fStack_37c;
  undefined1 local_378 [8];
  float fStack_370;
  float fStack_36c;
  undefined1 local_368 [8];
  float fStack_360;
  float fStack_35c;
  undefined1 local_358 [8];
  float fStack_350;
  float fStack_34c;
  undefined1 local_348 [8];
  float fStack_340;
  float fStack_33c;
  undefined1 local_338 [8];
  float fStack_330;
  float fStack_32c;
  undefined1 local_328 [8];
  float fStack_320;
  float fStack_31c;
  undefined1 local_318 [8];
  float fStack_310;
  float fStack_30c;
  undefined1 local_308 [8];
  float fStack_300;
  float fStack_2fc;
  undefined1 auStack_2f8 [16];
  undefined1 local_2e8 [8];
  float fStack_2e0;
  float fStack_2dc;
  undefined1 local_2d8 [8];
  float fStack_2d0;
  float fStack_2cc;
  undefined1 local_2c8 [8];
  float fStack_2c0;
  float fStack_2bc;
  ulong local_2b8;
  Primitive *local_2b0;
  RTCFilterFunctionNArguments local_2a8;
  uint auStack_278 [4];
  undefined8 local_268;
  undefined4 local_260;
  undefined8 local_25c;
  undefined4 local_254;
  undefined4 local_250;
  uint local_24c;
  uint local_248;
  undefined1 local_238 [8];
  float fStack_230;
  float fStack_22c;
  undefined1 local_228 [8];
  float fStack_220;
  float fStack_21c;
  undefined1 local_218 [8];
  float fStack_210;
  float fStack_20c;
  undefined1 local_208 [8];
  float fStack_200;
  float fStack_1fc;
  undefined1 local_1f8 [16];
  undefined1 local_1e8 [8];
  float fStack_1e0;
  float fStack_1dc;
  undefined1 local_1d8 [8];
  float fStack_1d0;
  float fStack_1cc;
  undefined1 local_1c8 [8];
  float fStack_1c0;
  float fStack_1bc;
  undefined1 local_1b8 [32];
  float afStack_198 [8];
  undefined1 local_178 [32];
  undefined1 local_158 [32];
  undefined1 local_138 [32];
  float local_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  float fStack_108;
  float fStack_104;
  float fStack_100;
  float fStack_fc;
  float local_f8;
  float fStack_f4;
  float fStack_f0;
  float fStack_ec;
  float fStack_e8;
  float fStack_e4;
  float fStack_e0;
  float fStack_dc;
  float local_d8;
  float fStack_d4;
  float fStack_d0;
  float fStack_cc;
  float fStack_c8;
  float fStack_c4;
  float fStack_c0;
  float fStack_bc;
  undefined1 local_b8 [32];
  undefined1 local_98 [32];
  undefined1 local_78 [32];
  ulong auStack_58 [5];
  ulong uVar70;
  undefined1 auVar151 [32];
  undefined1 auVar328 [32];
  
  PVar8 = prim[1];
  uVar74 = (ulong)(byte)PVar8;
  lVar71 = uVar74 * 5;
  auVar101 = vsubps_avx((undefined1  [16])(ray->org).field_0,
                        *(undefined1 (*) [16])(prim + uVar74 * 0x19 + 6));
  fVar184 = *(float *)(prim + uVar74 * 0x19 + 0x12);
  auVar91._0_4_ = fVar184 * auVar101._0_4_;
  auVar91._4_4_ = fVar184 * auVar101._4_4_;
  auVar91._8_4_ = fVar184 * auVar101._8_4_;
  auVar91._12_4_ = fVar184 * auVar101._12_4_;
  auVar185._0_4_ = fVar184 * (ray->dir).field_0.m128[0];
  auVar185._4_4_ = fVar184 * (ray->dir).field_0.m128[1];
  auVar185._8_4_ = fVar184 * (ray->dir).field_0.m128[2];
  auVar185._12_4_ = fVar184 * (ray->dir).field_0.m128[3];
  auVar101 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar74 * 4 + 6)));
  auVar241 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar74 * 4 + 10)));
  auVar82._16_16_ = auVar241;
  auVar82._0_16_ = auVar101;
  auVar82 = vcvtdq2ps_avx(auVar82);
  auVar101 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + lVar71 + 6)));
  auVar241 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + lVar71 + 10)));
  auVar124._16_16_ = auVar241;
  auVar124._0_16_ = auVar101;
  auVar101 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar74 * 6 + 6)));
  auVar241 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar74 * 6 + 10)));
  auVar14 = vcvtdq2ps_avx(auVar124);
  auVar144._16_16_ = auVar241;
  auVar144._0_16_ = auVar101;
  auVar15 = vcvtdq2ps_avx(auVar144);
  auVar101 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar74 * 0xb + 6)));
  auVar241 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar74 * 0xb + 10)));
  auVar172._16_16_ = auVar241;
  auVar172._0_16_ = auVar101;
  uVar72 = (ulong)((uint)(byte)PVar8 * 0xc);
  auVar101 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar72 + 6)));
  auVar16 = vcvtdq2ps_avx(auVar172);
  auVar241 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar72 + 10)));
  auVar216._16_16_ = auVar241;
  auVar216._0_16_ = auVar101;
  auVar17 = vcvtdq2ps_avx(auVar216);
  auVar101 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar72 + uVar74 + 6)));
  auVar241 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar72 + uVar74 + 10)));
  auVar232._16_16_ = auVar241;
  auVar232._0_16_ = auVar101;
  auVar18 = vcvtdq2ps_avx(auVar232);
  lVar13 = uVar74 * 9;
  uVar72 = (ulong)(uint)((int)lVar13 * 2);
  auVar101 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar72 + 6)));
  auVar241 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar72 + 10)));
  auVar251._16_16_ = auVar241;
  auVar251._0_16_ = auVar101;
  auVar101 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar72 + uVar74 + 6)));
  auVar241 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar72 + uVar74 + 10)));
  auVar19 = vcvtdq2ps_avx(auVar251);
  auVar265._16_16_ = auVar241;
  auVar265._0_16_ = auVar101;
  auVar20 = vcvtdq2ps_avx(auVar265);
  uVar72 = (ulong)(uint)((int)lVar71 << 2);
  auVar101 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar72 + 6)));
  auVar241 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar72 + 10)));
  auVar276._16_16_ = auVar241;
  auVar276._0_16_ = auVar101;
  auVar21 = vcvtdq2ps_avx(auVar276);
  auVar101 = vshufps_avx(auVar185,auVar185,0);
  auVar241 = vshufps_avx(auVar185,auVar185,0x55);
  auVar22 = vshufps_avx(auVar185,auVar185,0xaa);
  fVar184 = auVar22._0_4_;
  fVar200 = auVar22._4_4_;
  fVar201 = auVar22._8_4_;
  fVar202 = auVar22._12_4_;
  fVar203 = auVar241._0_4_;
  fVar204 = auVar241._4_4_;
  fVar205 = auVar241._8_4_;
  fVar130 = auVar241._12_4_;
  fVar152 = auVar101._0_4_;
  fVar154 = auVar101._4_4_;
  fVar156 = auVar101._8_4_;
  fVar157 = auVar101._12_4_;
  auVar297._0_4_ = fVar152 * auVar82._0_4_ + fVar203 * auVar14._0_4_ + fVar184 * auVar15._0_4_;
  auVar297._4_4_ = fVar154 * auVar82._4_4_ + fVar204 * auVar14._4_4_ + fVar200 * auVar15._4_4_;
  auVar297._8_4_ = fVar156 * auVar82._8_4_ + fVar205 * auVar14._8_4_ + fVar201 * auVar15._8_4_;
  auVar297._12_4_ = fVar157 * auVar82._12_4_ + fVar130 * auVar14._12_4_ + fVar202 * auVar15._12_4_;
  auVar297._16_4_ = fVar152 * auVar82._16_4_ + fVar203 * auVar14._16_4_ + fVar184 * auVar15._16_4_;
  auVar297._20_4_ = fVar154 * auVar82._20_4_ + fVar204 * auVar14._20_4_ + fVar200 * auVar15._20_4_;
  auVar297._24_4_ = fVar156 * auVar82._24_4_ + fVar205 * auVar14._24_4_ + fVar201 * auVar15._24_4_;
  auVar297._28_4_ = fVar130 + in_register_000015dc + in_register_0000151c;
  auVar285._0_4_ = fVar152 * auVar16._0_4_ + fVar203 * auVar17._0_4_ + fVar184 * auVar18._0_4_;
  auVar285._4_4_ = fVar154 * auVar16._4_4_ + fVar204 * auVar17._4_4_ + fVar200 * auVar18._4_4_;
  auVar285._8_4_ = fVar156 * auVar16._8_4_ + fVar205 * auVar17._8_4_ + fVar201 * auVar18._8_4_;
  auVar285._12_4_ = fVar157 * auVar16._12_4_ + fVar130 * auVar17._12_4_ + fVar202 * auVar18._12_4_;
  auVar285._16_4_ = fVar152 * auVar16._16_4_ + fVar203 * auVar17._16_4_ + fVar184 * auVar18._16_4_;
  auVar285._20_4_ = fVar154 * auVar16._20_4_ + fVar204 * auVar17._20_4_ + fVar200 * auVar18._20_4_;
  auVar285._24_4_ = fVar156 * auVar16._24_4_ + fVar205 * auVar17._24_4_ + fVar201 * auVar18._24_4_;
  auVar285._28_4_ = fVar130 + in_register_000015dc + in_register_0000159c;
  auVar199._0_4_ = fVar152 * auVar19._0_4_ + fVar203 * auVar20._0_4_ + auVar21._0_4_ * fVar184;
  auVar199._4_4_ = fVar154 * auVar19._4_4_ + fVar204 * auVar20._4_4_ + auVar21._4_4_ * fVar200;
  auVar199._8_4_ = fVar156 * auVar19._8_4_ + fVar205 * auVar20._8_4_ + auVar21._8_4_ * fVar201;
  auVar199._12_4_ = fVar157 * auVar19._12_4_ + fVar130 * auVar20._12_4_ + auVar21._12_4_ * fVar202;
  auVar199._16_4_ = fVar152 * auVar19._16_4_ + fVar203 * auVar20._16_4_ + auVar21._16_4_ * fVar184;
  auVar199._20_4_ = fVar154 * auVar19._20_4_ + fVar204 * auVar20._20_4_ + auVar21._20_4_ * fVar200;
  auVar199._24_4_ = fVar156 * auVar19._24_4_ + fVar205 * auVar20._24_4_ + auVar21._24_4_ * fVar201;
  auVar199._28_4_ = fVar157 + fVar130 + fVar202;
  auVar101 = vshufps_avx(auVar91,auVar91,0);
  auVar241 = vshufps_avx(auVar91,auVar91,0x55);
  auVar22 = vshufps_avx(auVar91,auVar91,0xaa);
  fVar200 = auVar22._0_4_;
  fVar201 = auVar22._4_4_;
  fVar202 = auVar22._8_4_;
  fVar203 = auVar22._12_4_;
  fVar154 = auVar241._0_4_;
  fVar156 = auVar241._4_4_;
  fVar157 = auVar241._8_4_;
  fVar158 = auVar241._12_4_;
  fVar204 = auVar101._0_4_;
  fVar205 = auVar101._4_4_;
  fVar130 = auVar101._8_4_;
  fVar152 = auVar101._12_4_;
  fVar184 = auVar82._28_4_;
  auVar217._0_4_ = fVar204 * auVar82._0_4_ + fVar154 * auVar14._0_4_ + fVar200 * auVar15._0_4_;
  auVar217._4_4_ = fVar205 * auVar82._4_4_ + fVar156 * auVar14._4_4_ + fVar201 * auVar15._4_4_;
  auVar217._8_4_ = fVar130 * auVar82._8_4_ + fVar157 * auVar14._8_4_ + fVar202 * auVar15._8_4_;
  auVar217._12_4_ = fVar152 * auVar82._12_4_ + fVar158 * auVar14._12_4_ + fVar203 * auVar15._12_4_;
  auVar217._16_4_ = fVar204 * auVar82._16_4_ + fVar154 * auVar14._16_4_ + fVar200 * auVar15._16_4_;
  auVar217._20_4_ = fVar205 * auVar82._20_4_ + fVar156 * auVar14._20_4_ + fVar201 * auVar15._20_4_;
  auVar217._24_4_ = fVar130 * auVar82._24_4_ + fVar157 * auVar14._24_4_ + fVar202 * auVar15._24_4_;
  auVar217._28_4_ = fVar184 + auVar14._28_4_ + auVar15._28_4_;
  auVar125._0_4_ = fVar204 * auVar16._0_4_ + fVar154 * auVar17._0_4_ + fVar200 * auVar18._0_4_;
  auVar125._4_4_ = fVar205 * auVar16._4_4_ + fVar156 * auVar17._4_4_ + fVar201 * auVar18._4_4_;
  auVar125._8_4_ = fVar130 * auVar16._8_4_ + fVar157 * auVar17._8_4_ + fVar202 * auVar18._8_4_;
  auVar125._12_4_ = fVar152 * auVar16._12_4_ + fVar158 * auVar17._12_4_ + fVar203 * auVar18._12_4_;
  auVar125._16_4_ = fVar204 * auVar16._16_4_ + fVar154 * auVar17._16_4_ + fVar200 * auVar18._16_4_;
  auVar125._20_4_ = fVar205 * auVar16._20_4_ + fVar156 * auVar17._20_4_ + fVar201 * auVar18._20_4_;
  auVar125._24_4_ = fVar130 * auVar16._24_4_ + fVar157 * auVar17._24_4_ + fVar202 * auVar18._24_4_;
  auVar125._28_4_ = fVar184 + auVar15._28_4_ + auVar18._28_4_;
  auVar110._0_4_ = fVar204 * auVar19._0_4_ + fVar154 * auVar20._0_4_ + auVar21._0_4_ * fVar200;
  auVar110._4_4_ = fVar205 * auVar19._4_4_ + fVar156 * auVar20._4_4_ + auVar21._4_4_ * fVar201;
  auVar110._8_4_ = fVar130 * auVar19._8_4_ + fVar157 * auVar20._8_4_ + auVar21._8_4_ * fVar202;
  auVar110._12_4_ = fVar152 * auVar19._12_4_ + fVar158 * auVar20._12_4_ + auVar21._12_4_ * fVar203;
  auVar110._16_4_ = fVar204 * auVar19._16_4_ + fVar154 * auVar20._16_4_ + auVar21._16_4_ * fVar200;
  auVar110._20_4_ = fVar205 * auVar19._20_4_ + fVar156 * auVar20._20_4_ + auVar21._20_4_ * fVar201;
  auVar110._24_4_ = fVar130 * auVar19._24_4_ + fVar157 * auVar20._24_4_ + auVar21._24_4_ * fVar202;
  auVar110._28_4_ = fVar184 + auVar17._28_4_ + fVar203;
  auVar83._8_4_ = 0x7fffffff;
  auVar83._0_8_ = 0x7fffffff7fffffff;
  auVar83._12_4_ = 0x7fffffff;
  auVar83._16_4_ = 0x7fffffff;
  auVar83._20_4_ = 0x7fffffff;
  auVar83._24_4_ = 0x7fffffff;
  auVar83._28_4_ = 0x7fffffff;
  auVar145._8_4_ = 0x219392ef;
  auVar145._0_8_ = 0x219392ef219392ef;
  auVar145._12_4_ = 0x219392ef;
  auVar145._16_4_ = 0x219392ef;
  auVar145._20_4_ = 0x219392ef;
  auVar145._24_4_ = 0x219392ef;
  auVar145._28_4_ = 0x219392ef;
  auVar82 = vandps_avx(auVar297,auVar83);
  auVar82 = vcmpps_avx(auVar82,auVar145,1);
  auVar14 = vblendvps_avx(auVar297,auVar145,auVar82);
  auVar82 = vandps_avx(auVar285,auVar83);
  auVar82 = vcmpps_avx(auVar82,auVar145,1);
  auVar15 = vblendvps_avx(auVar285,auVar145,auVar82);
  auVar82 = vandps_avx(auVar199,auVar83);
  auVar82 = vcmpps_avx(auVar82,auVar145,1);
  auVar82 = vblendvps_avx(auVar199,auVar145,auVar82);
  auVar16 = vrcpps_avx(auVar14);
  fVar184 = auVar16._0_4_;
  fVar200 = auVar16._4_4_;
  auVar17._4_4_ = auVar14._4_4_ * fVar200;
  auVar17._0_4_ = auVar14._0_4_ * fVar184;
  fVar201 = auVar16._8_4_;
  auVar17._8_4_ = auVar14._8_4_ * fVar201;
  fVar202 = auVar16._12_4_;
  auVar17._12_4_ = auVar14._12_4_ * fVar202;
  fVar203 = auVar16._16_4_;
  auVar17._16_4_ = auVar14._16_4_ * fVar203;
  fVar204 = auVar16._20_4_;
  auVar17._20_4_ = auVar14._20_4_ * fVar204;
  fVar205 = auVar16._24_4_;
  auVar17._24_4_ = auVar14._24_4_ * fVar205;
  auVar17._28_4_ = auVar14._28_4_;
  auVar252._8_4_ = 0x3f800000;
  auVar252._0_8_ = &DAT_3f8000003f800000;
  auVar252._12_4_ = 0x3f800000;
  auVar252._16_4_ = 0x3f800000;
  auVar252._20_4_ = 0x3f800000;
  auVar252._24_4_ = 0x3f800000;
  auVar252._28_4_ = 0x3f800000;
  auVar17 = vsubps_avx(auVar252,auVar17);
  fVar184 = fVar184 + fVar184 * auVar17._0_4_;
  fVar200 = fVar200 + fVar200 * auVar17._4_4_;
  fVar201 = fVar201 + fVar201 * auVar17._8_4_;
  fVar202 = fVar202 + fVar202 * auVar17._12_4_;
  fVar203 = fVar203 + fVar203 * auVar17._16_4_;
  fVar204 = fVar204 + fVar204 * auVar17._20_4_;
  fVar205 = fVar205 + fVar205 * auVar17._24_4_;
  auVar14 = vrcpps_avx(auVar15);
  fVar130 = auVar14._0_4_;
  fVar152 = auVar14._4_4_;
  auVar18._4_4_ = fVar152 * auVar15._4_4_;
  auVar18._0_4_ = fVar130 * auVar15._0_4_;
  fVar154 = auVar14._8_4_;
  auVar18._8_4_ = fVar154 * auVar15._8_4_;
  fVar156 = auVar14._12_4_;
  auVar18._12_4_ = fVar156 * auVar15._12_4_;
  fVar157 = auVar14._16_4_;
  auVar18._16_4_ = fVar157 * auVar15._16_4_;
  fVar158 = auVar14._20_4_;
  auVar18._20_4_ = fVar158 * auVar15._20_4_;
  fVar159 = auVar14._24_4_;
  auVar18._24_4_ = fVar159 * auVar15._24_4_;
  auVar18._28_4_ = auVar17._28_4_;
  auVar14 = vsubps_avx(auVar252,auVar18);
  fVar130 = fVar130 + fVar130 * auVar14._0_4_;
  fVar152 = fVar152 + fVar152 * auVar14._4_4_;
  fVar154 = fVar154 + fVar154 * auVar14._8_4_;
  fVar156 = fVar156 + fVar156 * auVar14._12_4_;
  fVar157 = fVar157 + fVar157 * auVar14._16_4_;
  fVar158 = fVar158 + fVar158 * auVar14._20_4_;
  fVar159 = fVar159 + fVar159 * auVar14._24_4_;
  auVar14 = vrcpps_avx(auVar82);
  fVar160 = auVar14._0_4_;
  fVar176 = auVar14._4_4_;
  auVar15._4_4_ = fVar176 * auVar82._4_4_;
  auVar15._0_4_ = fVar160 * auVar82._0_4_;
  fVar178 = auVar14._8_4_;
  auVar15._8_4_ = fVar178 * auVar82._8_4_;
  fVar179 = auVar14._12_4_;
  auVar15._12_4_ = fVar179 * auVar82._12_4_;
  fVar181 = auVar14._16_4_;
  auVar15._16_4_ = fVar181 * auVar82._16_4_;
  fVar182 = auVar14._20_4_;
  auVar15._20_4_ = fVar182 * auVar82._20_4_;
  fVar183 = auVar14._24_4_;
  auVar15._24_4_ = fVar183 * auVar82._24_4_;
  auVar15._28_4_ = auVar82._28_4_;
  auVar82 = vsubps_avx(auVar252,auVar15);
  auVar101._8_8_ = 0;
  auVar101._0_8_ = *(ulong *)(prim + uVar74 * 7 + 6);
  auVar101 = vpmovsxwd_avx(auVar101);
  auVar241._8_8_ = 0;
  auVar241._0_8_ = *(ulong *)(prim + uVar74 * 7 + 0xe);
  auVar241 = vpmovsxwd_avx(auVar241);
  fVar160 = fVar160 + fVar160 * auVar82._0_4_;
  fVar176 = fVar176 + fVar176 * auVar82._4_4_;
  fVar178 = fVar178 + fVar178 * auVar82._8_4_;
  fVar179 = fVar179 + fVar179 * auVar82._12_4_;
  fVar181 = fVar181 + fVar181 * auVar82._16_4_;
  fVar182 = fVar182 + fVar182 * auVar82._20_4_;
  fVar183 = fVar183 + fVar183 * auVar82._24_4_;
  auVar84._16_16_ = auVar241;
  auVar84._0_16_ = auVar101;
  auVar82 = vcvtdq2ps_avx(auVar84);
  auVar82 = vsubps_avx(auVar82,auVar217);
  auVar22._8_8_ = 0;
  auVar22._0_8_ = *(ulong *)(prim + lVar13 + 6);
  auVar101 = vpmovsxwd_avx(auVar22);
  auVar197._8_8_ = 0;
  auVar197._0_8_ = *(ulong *)(prim + lVar13 + 0xe);
  auVar241 = vpmovsxwd_avx(auVar197);
  auVar75._0_4_ = fVar184 * auVar82._0_4_;
  auVar75._4_4_ = fVar200 * auVar82._4_4_;
  auVar75._8_4_ = fVar201 * auVar82._8_4_;
  auVar75._12_4_ = fVar202 * auVar82._12_4_;
  auVar19._16_4_ = fVar203 * auVar82._16_4_;
  auVar19._0_16_ = auVar75;
  auVar19._20_4_ = fVar204 * auVar82._20_4_;
  auVar19._24_4_ = fVar205 * auVar82._24_4_;
  auVar19._28_4_ = auVar82._28_4_;
  auVar233._16_16_ = auVar241;
  auVar233._0_16_ = auVar101;
  auVar82 = vcvtdq2ps_avx(auVar233);
  auVar82 = vsubps_avx(auVar82,auVar217);
  lVar71 = (ulong)(byte)PVar8 * 0x10;
  auVar140._8_8_ = 0;
  auVar140._0_8_ = *(ulong *)(prim + lVar71 + 6);
  auVar101 = vpmovsxwd_avx(auVar140);
  auVar100._8_8_ = 0;
  auVar100._0_8_ = *(ulong *)(prim + lVar71 + 0xe);
  auVar241 = vpmovsxwd_avx(auVar100);
  lVar71 = lVar71 + uVar74 * -2;
  auVar139._8_8_ = 0;
  auVar139._0_8_ = *(ulong *)(prim + lVar71 + 6);
  auVar22 = vpmovsxwd_avx(auVar139);
  auVar80._8_8_ = 0;
  auVar80._0_8_ = *(ulong *)(prim + lVar71 + 0xe);
  auVar197 = vpmovsxwd_avx(auVar80);
  auVar186._0_4_ = fVar184 * auVar82._0_4_;
  auVar186._4_4_ = fVar200 * auVar82._4_4_;
  auVar186._8_4_ = fVar201 * auVar82._8_4_;
  auVar186._12_4_ = fVar202 * auVar82._12_4_;
  auVar20._16_4_ = fVar203 * auVar82._16_4_;
  auVar20._0_16_ = auVar186;
  auVar20._20_4_ = fVar204 * auVar82._20_4_;
  auVar20._24_4_ = fVar205 * auVar82._24_4_;
  auVar20._28_4_ = auVar16._28_4_ + auVar17._28_4_;
  auVar218._16_16_ = auVar197;
  auVar218._0_16_ = auVar22;
  auVar82 = vcvtdq2ps_avx(auVar218);
  auVar82 = vsubps_avx(auVar82,auVar125);
  auVar206._0_4_ = fVar130 * auVar82._0_4_;
  auVar206._4_4_ = fVar152 * auVar82._4_4_;
  auVar206._8_4_ = fVar154 * auVar82._8_4_;
  auVar206._12_4_ = fVar156 * auVar82._12_4_;
  auVar16._16_4_ = fVar157 * auVar82._16_4_;
  auVar16._0_16_ = auVar206;
  auVar16._20_4_ = fVar158 * auVar82._20_4_;
  auVar16._24_4_ = fVar159 * auVar82._24_4_;
  auVar16._28_4_ = auVar82._28_4_;
  auVar234._16_16_ = auVar241;
  auVar234._0_16_ = auVar101;
  auVar82 = vcvtdq2ps_avx(auVar234);
  auVar82 = vsubps_avx(auVar82,auVar125);
  auVar117._8_8_ = 0;
  auVar117._0_8_ = *(ulong *)(prim + uVar72 + uVar74 + 6);
  auVar101 = vpmovsxwd_avx(auVar117);
  auVar6._8_8_ = 0;
  auVar6._0_8_ = *(ulong *)(prim + uVar72 + uVar74 + 0xe);
  auVar241 = vpmovsxwd_avx(auVar6);
  auVar115._0_4_ = fVar130 * auVar82._0_4_;
  auVar115._4_4_ = fVar152 * auVar82._4_4_;
  auVar115._8_4_ = fVar154 * auVar82._8_4_;
  auVar115._12_4_ = fVar156 * auVar82._12_4_;
  auVar21._16_4_ = fVar157 * auVar82._16_4_;
  auVar21._0_16_ = auVar115;
  auVar21._20_4_ = fVar158 * auVar82._20_4_;
  auVar21._24_4_ = fVar159 * auVar82._24_4_;
  auVar21._28_4_ = auVar82._28_4_;
  auVar146._16_16_ = auVar241;
  auVar146._0_16_ = auVar101;
  auVar82 = vcvtdq2ps_avx(auVar146);
  auVar82 = vsubps_avx(auVar82,auVar110);
  auVar7._8_8_ = 0;
  auVar7._0_8_ = *(ulong *)(prim + uVar74 * 0x17 + 6);
  auVar101 = vpmovsxwd_avx(auVar7);
  auVar228._8_8_ = 0;
  auVar228._0_8_ = *(ulong *)(prim + uVar74 * 0x17 + 0xe);
  auVar241 = vpmovsxwd_avx(auVar228);
  auVar131._0_4_ = fVar160 * auVar82._0_4_;
  auVar131._4_4_ = fVar176 * auVar82._4_4_;
  auVar131._8_4_ = fVar178 * auVar82._8_4_;
  auVar131._12_4_ = fVar179 * auVar82._12_4_;
  auVar23._16_4_ = fVar181 * auVar82._16_4_;
  auVar23._0_16_ = auVar131;
  auVar23._20_4_ = fVar182 * auVar82._20_4_;
  auVar23._24_4_ = fVar183 * auVar82._24_4_;
  auVar23._28_4_ = auVar82._28_4_;
  auVar235._16_16_ = auVar241;
  auVar235._0_16_ = auVar101;
  auVar82 = vcvtdq2ps_avx(auVar235);
  auVar82 = vsubps_avx(auVar82,auVar110);
  auVar92._0_4_ = fVar160 * auVar82._0_4_;
  auVar92._4_4_ = fVar176 * auVar82._4_4_;
  auVar92._8_4_ = fVar178 * auVar82._8_4_;
  auVar92._12_4_ = fVar179 * auVar82._12_4_;
  auVar24._16_4_ = fVar181 * auVar82._16_4_;
  auVar24._0_16_ = auVar92;
  auVar24._20_4_ = fVar182 * auVar82._20_4_;
  auVar24._24_4_ = fVar183 * auVar82._24_4_;
  auVar24._28_4_ = auVar82._28_4_;
  auVar101 = vpminsd_avx(auVar19._16_16_,auVar20._16_16_);
  auVar241 = vpminsd_avx(auVar75,auVar186);
  auVar277._16_16_ = auVar101;
  auVar277._0_16_ = auVar241;
  auVar101 = vpminsd_avx(auVar16._16_16_,auVar21._16_16_);
  auVar241 = vpminsd_avx(auVar206,auVar115);
  auVar286._16_16_ = auVar101;
  auVar286._0_16_ = auVar241;
  auVar82 = vmaxps_avx(auVar277,auVar286);
  auVar101 = vpminsd_avx(auVar23._16_16_,auVar24._16_16_);
  auVar241 = vpminsd_avx(auVar131,auVar92);
  auVar312._16_16_ = auVar101;
  auVar312._0_16_ = auVar241;
  uVar2 = *(undefined4 *)((long)&(ray->org).field_0 + 0xc);
  auVar318._4_4_ = uVar2;
  auVar318._0_4_ = uVar2;
  auVar318._8_4_ = uVar2;
  auVar318._12_4_ = uVar2;
  auVar318._16_4_ = uVar2;
  auVar318._20_4_ = uVar2;
  auVar318._24_4_ = uVar2;
  auVar318._28_4_ = uVar2;
  auVar14 = vmaxps_avx(auVar312,auVar318);
  auVar82 = vmaxps_avx(auVar82,auVar14);
  local_178._4_4_ = auVar82._4_4_ * 0.99999964;
  local_178._0_4_ = auVar82._0_4_ * 0.99999964;
  local_178._8_4_ = auVar82._8_4_ * 0.99999964;
  local_178._12_4_ = auVar82._12_4_ * 0.99999964;
  local_178._16_4_ = auVar82._16_4_ * 0.99999964;
  local_178._20_4_ = auVar82._20_4_ * 0.99999964;
  local_178._24_4_ = auVar82._24_4_ * 0.99999964;
  local_178._28_4_ = auVar82._28_4_;
  auVar101 = vpmaxsd_avx(auVar19._16_16_,auVar20._16_16_);
  auVar241 = vpmaxsd_avx(auVar75,auVar186);
  auVar85._16_16_ = auVar101;
  auVar85._0_16_ = auVar241;
  auVar101 = vpmaxsd_avx(auVar16._16_16_,auVar21._16_16_);
  auVar241 = vpmaxsd_avx(auVar206,auVar115);
  auVar126._16_16_ = auVar101;
  auVar126._0_16_ = auVar241;
  auVar82 = vminps_avx(auVar85,auVar126);
  auVar101 = vpmaxsd_avx(auVar23._16_16_,auVar24._16_16_);
  auVar241 = vpmaxsd_avx(auVar131,auVar92);
  fVar184 = ray->tfar;
  auVar147._4_4_ = fVar184;
  auVar147._0_4_ = fVar184;
  auVar147._8_4_ = fVar184;
  auVar147._12_4_ = fVar184;
  auVar147._16_4_ = fVar184;
  auVar147._20_4_ = fVar184;
  auVar147._24_4_ = fVar184;
  auVar147._28_4_ = fVar184;
  auVar111._16_16_ = auVar101;
  auVar111._0_16_ = auVar241;
  auVar14 = vminps_avx(auVar111,auVar147);
  auVar82 = vminps_avx(auVar82,auVar14);
  auVar14._4_4_ = auVar82._4_4_ * 1.0000004;
  auVar14._0_4_ = auVar82._0_4_ * 1.0000004;
  auVar14._8_4_ = auVar82._8_4_ * 1.0000004;
  auVar14._12_4_ = auVar82._12_4_ * 1.0000004;
  auVar14._16_4_ = auVar82._16_4_ * 1.0000004;
  auVar14._20_4_ = auVar82._20_4_ * 1.0000004;
  auVar14._24_4_ = auVar82._24_4_ * 1.0000004;
  auVar14._28_4_ = auVar82._28_4_;
  auVar82 = vcmpps_avx(local_178,auVar14,2);
  auVar101 = vpshufd_avx(ZEXT116((byte)PVar8),0);
  auVar112._16_16_ = auVar101;
  auVar112._0_16_ = auVar101;
  auVar14 = vcvtdq2ps_avx(auVar112);
  auVar14 = vcmpps_avx(_DAT_02020f40,auVar14,1);
  auVar82 = vandps_avx(auVar82,auVar14);
  uVar68 = vmovmskps_avx(auVar82);
  local_4d9 = uVar68 != 0;
  if (uVar68 == 0) {
    return local_4d9;
  }
  uVar68 = uVar68 & 0xff;
  auVar86._16_16_ = mm_lookupmask_ps._240_16_;
  auVar86._0_16_ = mm_lookupmask_ps._240_16_;
  local_1b8 = vblendps_avx(auVar86,ZEXT832(0) << 0x20,0x80);
  auVar319 = ZEXT1664((undefined1  [16])0x0);
  local_2b0 = prim;
LAB_0110b16a:
  uVar74 = (ulong)uVar68;
  lVar71 = 0;
  if (uVar74 != 0) {
    for (; (uVar68 >> lVar71 & 1) == 0; lVar71 = lVar71 + 1) {
    }
  }
  local_430 = (ulong)*(uint *)(local_2b0 + 2);
  local_2b8 = (ulong)*(uint *)(local_2b0 + lVar71 * 4 + 6);
  pGVar9 = (context->scene->geometries).items[local_430].ptr;
  uVar72 = (ulong)*(uint *)(*(long *)&pGVar9->field_0x58 +
                           pGVar9[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i * local_2b8);
  p_Var10 = pGVar9[1].intersectionFilterN;
  pvVar11 = pGVar9[2].userPtr;
  _Var12 = pGVar9[2].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  pfVar1 = (float *)(_Var12 + uVar72 * (long)pvVar11);
  fVar184 = *pfVar1;
  fVar200 = pfVar1[1];
  fVar201 = pfVar1[2];
  fVar202 = pfVar1[3];
  pfVar1 = (float *)(_Var12 + (uVar72 + 1) * (long)pvVar11);
  fVar203 = *pfVar1;
  fVar204 = pfVar1[1];
  fVar205 = pfVar1[2];
  fVar130 = pfVar1[3];
  pfVar1 = (float *)(_Var12 + (uVar72 + 2) * (long)pvVar11);
  fVar152 = *pfVar1;
  fVar154 = pfVar1[1];
  fVar156 = pfVar1[2];
  fVar157 = pfVar1[3];
  pfVar1 = (float *)(_Var12 + (long)pvVar11 * (uVar72 + 3));
  fVar158 = *pfVar1;
  fVar159 = pfVar1[1];
  fVar160 = pfVar1[2];
  fVar176 = pfVar1[3];
  uVar74 = uVar74 - 1 & uVar74;
  lVar71 = *(long *)&pGVar9[1].time_range.upper;
  pfVar1 = (float *)(lVar71 + (long)p_Var10 * uVar72);
  fVar178 = *pfVar1;
  fVar179 = pfVar1[1];
  fVar181 = pfVar1[2];
  fVar182 = pfVar1[3];
  pfVar1 = (float *)(lVar71 + (long)p_Var10 * (uVar72 + 1));
  fVar183 = *pfVar1;
  fVar153 = pfVar1[1];
  fVar155 = pfVar1[2];
  fVar287 = pfVar1[3];
  pfVar1 = (float *)(lVar71 + (long)p_Var10 * (uVar72 + 2));
  fVar177 = *pfVar1;
  fVar288 = pfVar1[1];
  fVar180 = pfVar1[2];
  fVar289 = pfVar1[3];
  lVar13 = 0;
  if (uVar74 != 0) {
    for (; (uVar74 >> lVar13 & 1) == 0; lVar13 = lVar13 + 1) {
    }
  }
  pfVar1 = (float *)(lVar71 + (long)p_Var10 * (uVar72 + 3));
  fVar290 = *pfVar1;
  fVar291 = pfVar1[1];
  fVar292 = pfVar1[2];
  fVar220 = pfVar1[3];
  if (((uVar74 != 0) && (uVar72 = uVar74 - 1 & uVar74, uVar72 != 0)) && (lVar71 = 0, uVar72 != 0)) {
    for (; (uVar72 >> lVar71 & 1) == 0; lVar71 = lVar71 + 1) {
    }
  }
  fVar293 = auVar319._8_4_;
  fVar221 = auVar319._12_4_;
  local_448._0_4_ =
       fVar178 * 0.16666667 + fVar183 * 0.6666667 + fVar177 * 0.16666667 + fVar290 * 0.0;
  local_448._4_4_ =
       fVar179 * 0.16666667 + fVar153 * 0.6666667 + fVar288 * 0.16666667 + fVar291 * 0.0;
  fStack_440 = fVar181 * 0.16666667 + fVar155 * 0.6666667 + fVar180 * 0.16666667 + fVar292 * fVar293
  ;
  fStack_43c = fVar182 * 0.16666667 + fVar287 * 0.6666667 + fVar289 * 0.16666667 + fVar220 * fVar221
  ;
  auVar93._0_4_ = fVar177 * 0.5 + fVar290 * 0.0;
  auVar93._4_4_ = fVar288 * 0.5 + fVar291 * 0.0;
  auVar93._8_4_ = fVar180 * 0.5 + fVar292 * fVar293;
  auVar93._12_4_ = fVar289 * 0.5 + fVar220 * fVar221;
  auVar267._0_4_ = fVar183 * 0.0;
  auVar267._4_4_ = fVar153 * 0.0;
  auVar267._8_4_ = fVar293 * fVar155;
  auVar267._12_4_ = fVar221 * fVar287;
  auVar101 = vsubps_avx(auVar93,auVar267);
  auVar268._0_4_ = fVar178 * 0.5;
  auVar268._4_4_ = fVar179 * 0.5;
  auVar268._8_4_ = fVar181 * 0.5;
  auVar268._12_4_ = fVar182 * 0.5;
  auVar80 = vsubps_avx(auVar101,auVar268);
  auVar269._0_4_ = fVar184 * 0.16666667 + fVar203 * 0.6666667 + fVar152 * 0.16666667 + fVar158 * 0.0
  ;
  auVar269._4_4_ = fVar200 * 0.16666667 + fVar204 * 0.6666667 + fVar154 * 0.16666667 + fVar159 * 0.0
  ;
  auVar269._8_4_ =
       fVar201 * 0.16666667 + fVar205 * 0.6666667 + fVar156 * 0.16666667 + fVar293 * fVar160;
  auVar269._12_4_ =
       fVar202 * 0.16666667 + fVar130 * 0.6666667 + fVar157 * 0.16666667 + fVar221 * fVar176;
  auVar279._0_4_ = fVar152 * 0.5 + fVar158 * 0.0;
  auVar279._4_4_ = fVar154 * 0.5 + fVar159 * 0.0;
  auVar279._8_4_ = fVar156 * 0.5 + fVar293 * fVar160;
  auVar279._12_4_ = fVar157 * 0.5 + fVar221 * fVar176;
  auVar294._0_4_ = fVar203 * 0.0;
  auVar294._4_4_ = fVar204 * 0.0;
  auVar294._8_4_ = fVar293 * fVar205;
  auVar294._12_4_ = fVar221 * fVar130;
  auVar101 = vsubps_avx(auVar279,auVar294);
  auVar295._0_4_ = fVar184 * 0.5;
  auVar295._4_4_ = fVar200 * 0.5;
  auVar295._8_4_ = fVar201 * 0.5;
  auVar295._12_4_ = fVar202 * 0.5;
  auVar197 = vsubps_avx(auVar101,auVar295);
  auVar308._0_4_ = fVar178 * 0.0;
  auVar308._4_4_ = fVar179 * 0.0;
  auVar308._8_4_ = fVar293 * fVar181;
  auVar308._12_4_ = fVar221 * fVar182;
  local_458._0_4_ =
       auVar308._0_4_ + fVar183 * 0.16666667 + fVar177 * 0.6666667 + fVar290 * 0.16666667;
  local_458._4_4_ =
       auVar308._4_4_ + fVar153 * 0.16666667 + fVar288 * 0.6666667 + fVar291 * 0.16666667;
  fStack_450 = auVar308._8_4_ + fVar155 * 0.16666667 + fVar180 * 0.6666667 + fVar292 * 0.16666667;
  fStack_44c = auVar308._12_4_ + fVar287 * 0.16666667 + fVar289 * 0.6666667 + fVar220 * 0.16666667;
  auVar237._0_4_ = fVar177 * 0.0 + fVar290 * 0.5;
  auVar237._4_4_ = fVar288 * 0.0 + fVar291 * 0.5;
  auVar237._8_4_ = fVar180 * fVar293 + fVar292 * 0.5;
  auVar237._12_4_ = fVar289 * fVar221 + fVar220 * 0.5;
  auVar132._0_4_ = fVar183 * 0.5;
  auVar132._4_4_ = fVar153 * 0.5;
  auVar132._8_4_ = fVar155 * 0.5;
  auVar132._12_4_ = fVar287 * 0.5;
  auVar101 = vsubps_avx(auVar237,auVar132);
  auVar117 = vsubps_avx(auVar101,auVar308);
  auVar187._0_4_ = fVar184 * 0.0;
  auVar187._4_4_ = fVar200 * 0.0;
  auVar187._8_4_ = fVar293 * fVar201;
  auVar187._12_4_ = fVar221 * fVar202;
  auVar238._0_4_ =
       fVar203 * 0.16666667 + fVar152 * 0.6666667 + fVar158 * 0.16666667 + auVar187._0_4_;
  auVar238._4_4_ =
       fVar204 * 0.16666667 + fVar154 * 0.6666667 + fVar159 * 0.16666667 + auVar187._4_4_;
  auVar238._8_4_ =
       fVar205 * 0.16666667 + fVar156 * 0.6666667 + fVar160 * 0.16666667 + auVar187._8_4_;
  auVar238._12_4_ =
       fVar130 * 0.16666667 + fVar157 * 0.6666667 + fVar176 * 0.16666667 + auVar187._12_4_;
  auVar207._0_4_ = fVar152 * 0.0 + fVar158 * 0.5;
  auVar207._4_4_ = fVar154 * 0.0 + fVar159 * 0.5;
  auVar207._8_4_ = fVar293 * fVar156 + fVar160 * 0.5;
  auVar207._12_4_ = fVar221 * fVar157 + fVar176 * 0.5;
  auVar161._0_4_ = fVar203 * 0.5;
  auVar161._4_4_ = fVar204 * 0.5;
  auVar161._8_4_ = fVar205 * 0.5;
  auVar161._12_4_ = fVar130 * 0.5;
  auVar101 = vsubps_avx(auVar207,auVar161);
  auVar100 = vsubps_avx(auVar101,auVar187);
  auVar101 = vshufps_avx(auVar80,auVar80,0xc9);
  auVar241 = vshufps_avx(auVar269,auVar269,0xc9);
  fVar178 = auVar80._0_4_;
  auVar208._0_4_ = fVar178 * auVar241._0_4_;
  fVar179 = auVar80._4_4_;
  auVar208._4_4_ = fVar179 * auVar241._4_4_;
  fVar181 = auVar80._8_4_;
  auVar208._8_4_ = fVar181 * auVar241._8_4_;
  fVar182 = auVar80._12_4_;
  auVar208._12_4_ = fVar182 * auVar241._12_4_;
  auVar223._0_4_ = auVar269._0_4_ * auVar101._0_4_;
  auVar223._4_4_ = auVar269._4_4_ * auVar101._4_4_;
  auVar223._8_4_ = auVar269._8_4_ * auVar101._8_4_;
  auVar223._12_4_ = auVar269._12_4_ * auVar101._12_4_;
  auVar241 = vsubps_avx(auVar223,auVar208);
  auVar22 = vshufps_avx(auVar241,auVar241,0xc9);
  auVar241 = vshufps_avx(auVar197,auVar197,0xc9);
  auVar209._0_4_ = fVar178 * auVar241._0_4_;
  auVar209._4_4_ = fVar179 * auVar241._4_4_;
  auVar209._8_4_ = fVar181 * auVar241._8_4_;
  auVar209._12_4_ = fVar182 * auVar241._12_4_;
  auVar162._0_4_ = auVar197._0_4_ * auVar101._0_4_;
  auVar162._4_4_ = auVar197._4_4_ * auVar101._4_4_;
  auVar162._8_4_ = auVar197._8_4_ * auVar101._8_4_;
  auVar162._12_4_ = auVar197._12_4_ * auVar101._12_4_;
  auVar101 = vsubps_avx(auVar162,auVar209);
  auVar197 = vshufps_avx(auVar101,auVar101,0xc9);
  auVar101 = vshufps_avx(auVar117,auVar117,0xc9);
  auVar241 = vshufps_avx(auVar238,auVar238,0xc9);
  fVar183 = auVar117._0_4_;
  auVar163._0_4_ = fVar183 * auVar241._0_4_;
  fVar153 = auVar117._4_4_;
  auVar163._4_4_ = fVar153 * auVar241._4_4_;
  fVar155 = auVar117._8_4_;
  auVar163._8_4_ = fVar155 * auVar241._8_4_;
  fVar287 = auVar117._12_4_;
  auVar163._12_4_ = fVar287 * auVar241._12_4_;
  auVar239._0_4_ = auVar238._0_4_ * auVar101._0_4_;
  auVar239._4_4_ = auVar238._4_4_ * auVar101._4_4_;
  auVar239._8_4_ = auVar238._8_4_ * auVar101._8_4_;
  auVar239._12_4_ = auVar238._12_4_ * auVar101._12_4_;
  auVar241 = vsubps_avx(auVar239,auVar163);
  auVar140 = vshufps_avx(auVar241,auVar241,0xc9);
  auVar241 = vshufps_avx(auVar100,auVar100,0xc9);
  auVar240._0_4_ = auVar241._0_4_ * fVar183;
  auVar240._4_4_ = auVar241._4_4_ * fVar153;
  auVar240._8_4_ = auVar241._8_4_ * fVar155;
  auVar240._12_4_ = auVar241._12_4_ * fVar287;
  auVar188._0_4_ = auVar101._0_4_ * auVar100._0_4_;
  auVar188._4_4_ = auVar101._4_4_ * auVar100._4_4_;
  auVar188._8_4_ = auVar101._8_4_ * auVar100._8_4_;
  auVar188._12_4_ = auVar101._12_4_ * auVar100._12_4_;
  auVar241 = vsubps_avx(auVar188,auVar240);
  auVar101 = vdpps_avx(auVar22,auVar22,0x7f);
  auVar100 = vshufps_avx(auVar241,auVar241,0xc9);
  fVar203 = auVar101._0_4_;
  auVar270._4_12_ = auVar319._4_12_;
  auVar270._0_4_ = fVar203;
  auVar241 = vrsqrtss_avx(auVar270,auVar270);
  fVar184 = auVar241._0_4_;
  auVar241 = vdpps_avx(auVar22,auVar197,0x7f);
  auVar139 = ZEXT416((uint)(fVar184 * 1.5 - fVar203 * 0.5 * fVar184 * fVar184 * fVar184));
  auVar139 = vshufps_avx(auVar139,auVar139,0);
  fVar184 = auVar139._0_4_ * auVar22._0_4_;
  fVar200 = auVar139._4_4_ * auVar22._4_4_;
  fVar201 = auVar139._8_4_ * auVar22._8_4_;
  fVar202 = auVar139._12_4_ * auVar22._12_4_;
  auVar101 = vshufps_avx(auVar101,auVar101,0);
  auVar255._0_4_ = auVar197._0_4_ * auVar101._0_4_;
  auVar255._4_4_ = auVar197._4_4_ * auVar101._4_4_;
  auVar255._8_4_ = auVar197._8_4_ * auVar101._8_4_;
  auVar255._12_4_ = auVar197._12_4_ * auVar101._12_4_;
  auVar101 = vshufps_avx(auVar241,auVar241,0);
  auVar224._0_4_ = auVar101._0_4_ * auVar22._0_4_;
  auVar224._4_4_ = auVar101._4_4_ * auVar22._4_4_;
  auVar224._8_4_ = auVar101._8_4_ * auVar22._8_4_;
  auVar224._12_4_ = auVar101._12_4_ * auVar22._12_4_;
  auVar6 = vsubps_avx(auVar255,auVar224);
  auVar241 = vrcpss_avx(auVar270,auVar270);
  auVar101 = vdpps_avx(auVar140,auVar140,0x7f);
  auVar241 = ZEXT416((uint)(auVar241._0_4_ * (2.0 - fVar203 * auVar241._0_4_)));
  auVar22 = vshufps_avx(auVar241,auVar241,0);
  fVar203 = auVar101._0_4_;
  auVar242._4_12_ = auVar319._4_12_;
  auVar242._0_4_ = fVar203;
  auVar241 = vrsqrtss_avx(auVar242,auVar242);
  fVar204 = auVar241._0_4_;
  auVar241 = ZEXT416((uint)(fVar204 * 1.5 - fVar203 * 0.5 * fVar204 * fVar204 * fVar204));
  auVar197 = vshufps_avx(auVar241,auVar241,0);
  auVar241 = vdpps_avx(auVar140,auVar100,0x7f);
  fVar204 = auVar197._0_4_ * auVar140._0_4_;
  fVar205 = auVar197._4_4_ * auVar140._4_4_;
  fVar130 = auVar197._8_4_ * auVar140._8_4_;
  fVar152 = auVar197._12_4_ * auVar140._12_4_;
  auVar101 = vshufps_avx(auVar101,auVar101,0);
  auVar210._0_4_ = auVar101._0_4_ * auVar100._0_4_;
  auVar210._4_4_ = auVar101._4_4_ * auVar100._4_4_;
  auVar210._8_4_ = auVar101._8_4_ * auVar100._8_4_;
  auVar210._12_4_ = auVar101._12_4_ * auVar100._12_4_;
  auVar101 = vshufps_avx(auVar241,auVar241,0);
  auVar164._0_4_ = auVar101._0_4_ * auVar140._0_4_;
  auVar164._4_4_ = auVar101._4_4_ * auVar140._4_4_;
  auVar164._8_4_ = auVar101._8_4_ * auVar140._8_4_;
  auVar164._12_4_ = auVar101._12_4_ * auVar140._12_4_;
  auVar100 = vsubps_avx(auVar210,auVar164);
  auVar101 = vrcpss_avx(auVar242,auVar242);
  auVar101 = ZEXT416((uint)((2.0 - fVar203 * auVar101._0_4_) * auVar101._0_4_));
  auVar101 = vshufps_avx(auVar101,auVar101,0);
  auVar241 = vshufps_avx(_local_448,_local_448,0xff);
  auVar243._0_4_ = auVar241._0_4_ * fVar184;
  auVar243._4_4_ = auVar241._4_4_ * fVar200;
  auVar243._8_4_ = auVar241._8_4_ * fVar201;
  auVar243._12_4_ = auVar241._12_4_ * fVar202;
  _local_358 = vsubps_avx(_local_448,auVar243);
  auVar140 = vshufps_avx(auVar80,auVar80,0xff);
  auVar189._0_4_ =
       auVar140._0_4_ * fVar184 + auVar241._0_4_ * auVar139._0_4_ * auVar22._0_4_ * auVar6._0_4_;
  auVar189._4_4_ =
       auVar140._4_4_ * fVar200 + auVar241._4_4_ * auVar139._4_4_ * auVar22._4_4_ * auVar6._4_4_;
  auVar189._8_4_ =
       auVar140._8_4_ * fVar201 + auVar241._8_4_ * auVar139._8_4_ * auVar22._8_4_ * auVar6._8_4_;
  auVar189._12_4_ =
       auVar140._12_4_ * fVar202 +
       auVar241._12_4_ * auVar139._12_4_ * auVar22._12_4_ * auVar6._12_4_;
  auVar140 = vsubps_avx(auVar80,auVar189);
  local_368._0_4_ = auVar243._0_4_ + (float)local_448._0_4_;
  local_368._4_4_ = auVar243._4_4_ + (float)local_448._4_4_;
  fStack_360 = auVar243._8_4_ + fStack_440;
  fStack_35c = auVar243._12_4_ + fStack_43c;
  auVar241 = vshufps_avx(_local_458,_local_458,0xff);
  auVar94._0_4_ = fVar204 * auVar241._0_4_;
  auVar94._4_4_ = fVar205 * auVar241._4_4_;
  auVar94._8_4_ = fVar130 * auVar241._8_4_;
  auVar94._12_4_ = fVar152 * auVar241._12_4_;
  _local_378 = vsubps_avx(_local_458,auVar94);
  auVar22 = vshufps_avx(auVar117,auVar117,0xff);
  auVar76._0_4_ =
       fVar204 * auVar22._0_4_ + auVar241._0_4_ * auVar197._0_4_ * auVar100._0_4_ * auVar101._0_4_;
  auVar76._4_4_ =
       fVar205 * auVar22._4_4_ + auVar241._4_4_ * auVar197._4_4_ * auVar100._4_4_ * auVar101._4_4_;
  auVar76._8_4_ =
       fVar130 * auVar22._8_4_ + auVar241._8_4_ * auVar197._8_4_ * auVar100._8_4_ * auVar101._8_4_;
  auVar76._12_4_ =
       fVar152 * auVar22._12_4_ +
       auVar241._12_4_ * auVar197._12_4_ * auVar100._12_4_ * auVar101._12_4_;
  auVar101 = vsubps_avx(auVar117,auVar76);
  local_428 = (float)local_458._0_4_ + auVar94._0_4_;
  fStack_424 = (float)local_458._4_4_ + auVar94._4_4_;
  fStack_420 = fStack_450 + auVar94._8_4_;
  fStack_41c = fStack_44c + auVar94._12_4_;
  local_388._0_4_ = local_358._0_4_ + auVar140._0_4_ * 0.33333334;
  local_388._4_4_ = local_358._4_4_ + auVar140._4_4_ * 0.33333334;
  fStack_380 = local_358._8_4_ + auVar140._8_4_ * 0.33333334;
  fStack_37c = local_358._12_4_ + auVar140._12_4_ * 0.33333334;
  auVar77._0_4_ = auVar101._0_4_ * 0.33333334;
  auVar77._4_4_ = auVar101._4_4_ * 0.33333334;
  auVar77._8_4_ = auVar101._8_4_ * 0.33333334;
  auVar77._12_4_ = auVar101._12_4_ * 0.33333334;
  _local_398 = vsubps_avx(_local_378,auVar77);
  aVar5 = (ray->org).field_0;
  auVar22 = vsubps_avx(_local_358,(undefined1  [16])aVar5);
  auVar241 = vmovsldup_avx(auVar22);
  auVar101 = vmovshdup_avx(auVar22);
  auVar22 = vshufps_avx(auVar22,auVar22,0xaa);
  fVar184 = (pre->ray_space).vx.field_0.m128[0];
  fVar200 = (pre->ray_space).vx.field_0.m128[1];
  fVar201 = (pre->ray_space).vx.field_0.m128[2];
  fVar202 = (pre->ray_space).vx.field_0.m128[3];
  fVar203 = (pre->ray_space).vy.field_0.m128[0];
  fVar204 = (pre->ray_space).vy.field_0.m128[1];
  fVar205 = (pre->ray_space).vy.field_0.m128[2];
  fVar130 = (pre->ray_space).vy.field_0.m128[3];
  fVar152 = (pre->ray_space).vz.field_0.m128[0];
  fVar154 = (pre->ray_space).vz.field_0.m128[1];
  fVar156 = (pre->ray_space).vz.field_0.m128[2];
  fVar157 = (pre->ray_space).vz.field_0.m128[3];
  fVar158 = fVar184 * auVar241._0_4_ + fVar203 * auVar101._0_4_ + fVar152 * auVar22._0_4_;
  fVar160 = fVar200 * auVar241._4_4_ + fVar204 * auVar101._4_4_ + fVar154 * auVar22._4_4_;
  local_448._4_4_ = fVar160;
  local_448._0_4_ = fVar158;
  fStack_440 = fVar201 * auVar241._8_4_ + fVar205 * auVar101._8_4_ + fVar156 * auVar22._8_4_;
  fStack_43c = fVar202 * auVar241._12_4_ + fVar130 * auVar101._12_4_ + fVar157 * auVar22._12_4_;
  auVar22 = vsubps_avx(_local_388,(undefined1  [16])aVar5);
  auVar241 = vmovsldup_avx(auVar22);
  auVar101 = vmovshdup_avx(auVar22);
  auVar22 = vshufps_avx(auVar22,auVar22,0xaa);
  fVar159 = fVar184 * auVar241._0_4_ + auVar101._0_4_ * fVar203 + fVar152 * auVar22._0_4_;
  fVar176 = fVar200 * auVar241._4_4_ + auVar101._4_4_ * fVar204 + fVar154 * auVar22._4_4_;
  local_458._4_4_ = fVar176;
  local_458._0_4_ = fVar159;
  fStack_450 = fVar201 * auVar241._8_4_ + auVar101._8_4_ * fVar205 + fVar156 * auVar22._8_4_;
  fStack_44c = fVar202 * auVar241._12_4_ + auVar101._12_4_ * fVar130 + fVar157 * auVar22._12_4_;
  auVar241 = vsubps_avx(_local_398,(undefined1  [16])aVar5);
  auVar22 = vshufps_avx(auVar241,auVar241,0xaa);
  auVar101 = vmovshdup_avx(auVar241);
  auVar241 = vmovsldup_avx(auVar241);
  auVar322._0_4_ = auVar101._0_4_ * fVar203 + auVar22._0_4_ * fVar152 + fVar184 * auVar241._0_4_;
  auVar322._4_4_ = auVar101._4_4_ * fVar204 + auVar22._4_4_ * fVar154 + fVar200 * auVar241._4_4_;
  auVar322._8_4_ = auVar101._8_4_ * fVar205 + auVar22._8_4_ * fVar156 + fVar201 * auVar241._8_4_;
  auVar322._12_4_ = auVar101._12_4_ * fVar130 + auVar22._12_4_ * fVar157 + fVar202 * auVar241._12_4_
  ;
  auVar241 = vsubps_avx(_local_378,(undefined1  [16])aVar5);
  auVar22 = vshufps_avx(auVar241,auVar241,0xaa);
  auVar101 = vmovshdup_avx(auVar241);
  auVar241 = vmovsldup_avx(auVar241);
  auVar95._0_4_ = auVar241._0_4_ * fVar184 + auVar101._0_4_ * fVar203 + auVar22._0_4_ * fVar152;
  auVar95._4_4_ = auVar241._4_4_ * fVar200 + auVar101._4_4_ * fVar204 + auVar22._4_4_ * fVar154;
  auVar95._8_4_ = auVar241._8_4_ * fVar201 + auVar101._8_4_ * fVar205 + auVar22._8_4_ * fVar156;
  auVar95._12_4_ = auVar241._12_4_ * fVar202 + auVar101._12_4_ * fVar130 + auVar22._12_4_ * fVar157;
  auVar241 = vsubps_avx(_local_368,(undefined1  [16])aVar5);
  auVar22 = vshufps_avx(auVar241,auVar241,0xaa);
  auVar101 = vmovshdup_avx(auVar241);
  auVar241 = vmovsldup_avx(auVar241);
  auVar271._0_8_ =
       CONCAT44(auVar241._4_4_ * fVar200 + auVar101._4_4_ * fVar204 + auVar22._4_4_ * fVar154,
                auVar241._0_4_ * fVar184 + auVar101._0_4_ * fVar203 + auVar22._0_4_ * fVar152);
  auVar271._8_4_ = auVar241._8_4_ * fVar201 + auVar101._8_4_ * fVar205 + auVar22._8_4_ * fVar156;
  auVar271._12_4_ = auVar241._12_4_ * fVar202 + auVar101._12_4_ * fVar130 + auVar22._12_4_ * fVar157
  ;
  local_3a8._0_4_ = (float)local_368._0_4_ + (fVar178 + auVar189._0_4_) * 0.33333334;
  local_3a8._4_4_ = (float)local_368._4_4_ + (fVar179 + auVar189._4_4_) * 0.33333334;
  fStack_3a0 = fStack_360 + (fVar181 + auVar189._8_4_) * 0.33333334;
  fStack_39c = fStack_35c + (fVar182 + auVar189._12_4_) * 0.33333334;
  auVar241 = vsubps_avx(_local_3a8,(undefined1  [16])aVar5);
  auVar22 = vshufps_avx(auVar241,auVar241,0xaa);
  auVar101 = vmovshdup_avx(auVar241);
  auVar241 = vmovsldup_avx(auVar241);
  auVar256._0_8_ =
       CONCAT44(auVar241._4_4_ * fVar200 + auVar101._4_4_ * fVar204 + auVar22._4_4_ * fVar154,
                auVar241._0_4_ * fVar184 + auVar101._0_4_ * fVar203 + auVar22._0_4_ * fVar152);
  auVar256._8_4_ = auVar241._8_4_ * fVar201 + auVar101._8_4_ * fVar205 + auVar22._8_4_ * fVar156;
  auVar256._12_4_ = auVar241._12_4_ * fVar202 + auVar101._12_4_ * fVar130 + auVar22._12_4_ * fVar157
  ;
  auVar225._0_4_ = (fVar183 + auVar76._0_4_) * 0.33333334;
  auVar225._4_4_ = (fVar153 + auVar76._4_4_) * 0.33333334;
  auVar225._8_4_ = (fVar155 + auVar76._8_4_) * 0.33333334;
  auVar225._12_4_ = (fVar287 + auVar76._12_4_) * 0.33333334;
  auVar64._4_4_ = fStack_424;
  auVar64._0_4_ = local_428;
  auVar64._8_4_ = fStack_420;
  auVar64._12_4_ = fStack_41c;
  _local_3b8 = vsubps_avx(auVar64,auVar225);
  auVar241 = vsubps_avx(_local_3b8,(undefined1  [16])aVar5);
  auVar22 = vshufps_avx(auVar241,auVar241,0xaa);
  auVar101 = vmovshdup_avx(auVar241);
  auVar241 = vmovsldup_avx(auVar241);
  auVar226._0_8_ =
       CONCAT44(auVar101._4_4_ * fVar204 + auVar22._4_4_ * fVar154 + fVar200 * auVar241._4_4_,
                auVar101._0_4_ * fVar203 + auVar22._0_4_ * fVar152 + fVar184 * auVar241._0_4_);
  auVar226._8_4_ = auVar101._8_4_ * fVar205 + auVar22._8_4_ * fVar156 + fVar201 * auVar241._8_4_;
  auVar226._12_4_ = auVar101._12_4_ * fVar130 + auVar22._12_4_ * fVar157 + fVar202 * auVar241._12_4_
  ;
  auVar241 = vsubps_avx(auVar64,(undefined1  [16])aVar5);
  auVar22 = vshufps_avx(auVar241,auVar241,0xaa);
  auVar101 = vmovshdup_avx(auVar241);
  auVar241 = vmovsldup_avx(auVar241);
  auVar78._0_8_ =
       CONCAT44(fVar200 * auVar241._4_4_ + auVar101._4_4_ * fVar204 + auVar22._4_4_ * fVar154,
                fVar184 * auVar241._0_4_ + auVar101._0_4_ * fVar203 + auVar22._0_4_ * fVar152);
  auVar78._8_4_ = fVar201 * auVar241._8_4_ + auVar101._8_4_ * fVar205 + auVar22._8_4_ * fVar156;
  auVar78._12_4_ = fVar202 * auVar241._12_4_ + auVar101._12_4_ * fVar130 + auVar22._12_4_ * fVar157;
  _local_2c8 = vmovlhps_avx(_local_448,auVar271);
  _local_2d8 = vmovlhps_avx(_local_458,auVar256);
  _local_2e8 = vmovlhps_avx(auVar322,auVar226);
  _local_448 = vmovlhps_avx(auVar95,auVar78);
  auVar101 = vminps_avx(_local_2c8,_local_2d8);
  auVar241 = vminps_avx(_local_2e8,_local_448);
  auVar22 = vminps_avx(auVar101,auVar241);
  auVar101 = vmaxps_avx(_local_2c8,_local_2d8);
  auVar241 = vmaxps_avx(_local_2e8,_local_448);
  auVar101 = vmaxps_avx(auVar101,auVar241);
  auVar241 = vshufpd_avx(auVar22,auVar22,3);
  auVar22 = vminps_avx(auVar22,auVar241);
  auVar241 = vshufpd_avx(auVar101,auVar101,3);
  auVar241 = vmaxps_avx(auVar101,auVar241);
  auVar211._8_4_ = 0x7fffffff;
  auVar211._0_8_ = 0x7fffffff7fffffff;
  auVar211._12_4_ = 0x7fffffff;
  auVar101 = vandps_avx(auVar22,auVar211);
  auVar241 = vandps_avx(auVar241,auVar211);
  auVar101 = vmaxps_avx(auVar101,auVar241);
  auVar241 = vmovshdup_avx(auVar101);
  auVar101 = vmaxss_avx(auVar241,auVar101);
  fVar184 = auVar101._0_4_ * 9.536743e-07;
  register0x00001588 = auVar271._0_8_;
  local_318 = auVar271._0_8_;
  register0x00001448 = auVar256._0_8_;
  local_328 = auVar256._0_8_;
  register0x00001388 = auVar226._0_8_;
  local_338 = auVar226._0_8_;
  register0x00001548 = auVar78._0_8_;
  local_348 = auVar78._0_8_;
  _local_458 = ZEXT416((uint)fVar184);
  auVar101 = vshufps_avx(_local_458,ZEXT416((uint)fVar184),0);
  local_138._16_16_ = auVar101;
  local_138._0_16_ = auVar101;
  auVar79._0_8_ = auVar101._0_8_ ^ 0x8000000080000000;
  auVar79._8_4_ = auVar101._8_4_ ^ 0x80000000;
  auVar79._12_4_ = auVar101._12_4_ ^ 0x80000000;
  local_158._16_16_ = auVar79;
  local_158._0_16_ = auVar79;
  uVar73 = 0;
  uVar72 = 0;
  _local_1c8 = vsubps_avx(_local_2d8,_local_2c8);
  _local_1d8 = vsubps_avx(_local_2e8,_local_2d8);
  _local_1e8 = vsubps_avx(_local_448,_local_2e8);
  _local_208 = vsubps_avx(_local_368,_local_358);
  _local_218 = vsubps_avx(_local_3a8,_local_388);
  _local_228 = vsubps_avx(_local_3b8,_local_398);
  auVar65._4_4_ = fStack_424;
  auVar65._0_4_ = local_428;
  auVar65._8_4_ = fStack_420;
  auVar65._12_4_ = fStack_41c;
  _local_238 = vsubps_avx(auVar65,_local_378);
  local_498 = ZEXT816(0x3f80000000000000);
  local_1f8 = local_498;
  do {
    auVar101 = vshufps_avx(local_498,local_498,0x50);
    auVar323._8_4_ = 0x3f800000;
    auVar323._0_8_ = &DAT_3f8000003f800000;
    auVar323._12_4_ = 0x3f800000;
    auVar328._16_4_ = 0x3f800000;
    auVar328._0_16_ = auVar323;
    auVar328._20_4_ = 0x3f800000;
    auVar328._24_4_ = 0x3f800000;
    auVar328._28_4_ = 0x3f800000;
    auVar241 = vsubps_avx(auVar323,auVar101);
    fVar184 = auVar101._0_4_;
    fVar200 = auVar101._4_4_;
    fVar201 = auVar101._8_4_;
    fVar202 = auVar101._12_4_;
    fVar203 = auVar241._0_4_;
    fVar204 = auVar241._4_4_;
    fVar205 = auVar241._8_4_;
    fVar130 = auVar241._12_4_;
    auVar116._0_4_ = local_318._0_4_ * fVar184 + fVar203 * fVar158;
    auVar116._4_4_ = local_318._4_4_ * fVar200 + fVar204 * fVar160;
    auVar116._8_4_ = local_318._8_4_ * fVar201 + fVar205 * fVar158;
    auVar116._12_4_ = local_318._12_4_ * fVar202 + fVar130 * fVar160;
    auVar96._0_4_ = local_328._0_4_ * fVar184 + fVar159 * fVar203;
    auVar96._4_4_ = local_328._4_4_ * fVar200 + fVar176 * fVar204;
    auVar96._8_4_ = local_328._8_4_ * fVar201 + fVar159 * fVar205;
    auVar96._12_4_ = local_328._12_4_ * fVar202 + fVar176 * fVar130;
    auVar227._0_4_ = local_338._0_4_ * fVar184 + auVar322._0_4_ * fVar203;
    auVar227._4_4_ = local_338._4_4_ * fVar200 + auVar322._4_4_ * fVar204;
    auVar227._8_4_ = local_338._8_4_ * fVar201 + auVar322._0_4_ * fVar205;
    auVar227._12_4_ = local_338._12_4_ * fVar202 + auVar322._4_4_ * fVar130;
    auVar133._0_4_ = local_348._0_4_ * fVar184 + auVar95._0_4_ * fVar203;
    auVar133._4_4_ = local_348._4_4_ * fVar200 + auVar95._4_4_ * fVar204;
    auVar133._8_4_ = local_348._8_4_ * fVar201 + auVar95._0_4_ * fVar205;
    auVar133._12_4_ = local_348._12_4_ * fVar202 + auVar95._4_4_ * fVar130;
    auVar101 = vmovshdup_avx(local_1f8);
    auVar241 = vshufps_avx(local_1f8,local_1f8,0);
    auVar253._16_16_ = auVar241;
    auVar253._0_16_ = auVar241;
    auVar22 = vshufps_avx(local_1f8,local_1f8,0x55);
    auVar87._16_16_ = auVar22;
    auVar87._0_16_ = auVar22;
    auVar82 = vsubps_avx(auVar87,auVar253);
    auVar22 = vshufps_avx(auVar116,auVar116,0);
    auVar197 = vshufps_avx(auVar116,auVar116,0x55);
    auVar140 = vshufps_avx(auVar96,auVar96,0);
    auVar100 = vshufps_avx(auVar96,auVar96,0x55);
    auVar139 = vshufps_avx(auVar227,auVar227,0);
    auVar80 = vshufps_avx(auVar227,auVar227,0x55);
    auVar117 = vshufps_avx(auVar133,auVar133,0);
    auVar6 = vshufps_avx(auVar133,auVar133,0x55);
    auVar101 = ZEXT416((uint)((auVar101._0_4_ - local_1f8._0_4_) * 0.04761905));
    auVar101 = vshufps_avx(auVar101,auVar101,0);
    auVar266._0_4_ = auVar241._0_4_ + auVar82._0_4_ * 0.0;
    auVar266._4_4_ = auVar241._4_4_ + auVar82._4_4_ * 0.14285715;
    auVar266._8_4_ = auVar241._8_4_ + auVar82._8_4_ * 0.2857143;
    auVar266._12_4_ = auVar241._12_4_ + auVar82._12_4_ * 0.42857146;
    auVar266._16_4_ = auVar241._0_4_ + auVar82._16_4_ * 0.5714286;
    auVar266._20_4_ = auVar241._4_4_ + auVar82._20_4_ * 0.71428573;
    auVar266._24_4_ = auVar241._8_4_ + auVar82._24_4_ * 0.8571429;
    auVar266._28_4_ = auVar241._12_4_ + auVar82._28_4_;
    auVar14 = vsubps_avx(auVar328,auVar266);
    fVar179 = auVar140._0_4_;
    fVar182 = auVar140._4_4_;
    fVar177 = auVar140._8_4_;
    fVar180 = auVar140._12_4_;
    fVar184 = auVar14._0_4_;
    fVar203 = auVar14._4_4_;
    fVar152 = auVar14._8_4_;
    fVar178 = auVar14._12_4_;
    fVar314 = auVar22._12_4_;
    fVar183 = auVar14._16_4_;
    fVar153 = auVar14._20_4_;
    fVar155 = auVar14._24_4_;
    fVar220 = auVar100._0_4_;
    fVar221 = auVar100._4_4_;
    fVar222 = auVar100._8_4_;
    fVar307 = auVar100._12_4_;
    local_3d8._0_4_ = auVar197._0_4_;
    local_3d8._4_4_ = auVar197._4_4_;
    fStack_3d0 = auVar197._8_4_;
    fStack_3cc = auVar197._12_4_;
    fVar200 = auVar139._0_4_;
    fVar202 = auVar139._4_4_;
    fVar205 = auVar139._8_4_;
    fVar154 = auVar139._12_4_;
    fVar181 = auVar266._0_4_ * fVar200 + fVar179 * fVar184;
    fVar287 = auVar266._4_4_ * fVar202 + fVar182 * fVar203;
    fVar288 = auVar266._8_4_ * fVar205 + fVar177 * fVar152;
    fVar289 = auVar266._12_4_ * fVar154 + fVar180 * fVar178;
    fVar290 = auVar266._16_4_ * fVar200 + fVar179 * fVar183;
    fVar291 = auVar266._20_4_ * fVar202 + fVar182 * fVar153;
    fVar292 = auVar266._24_4_ * fVar205 + fVar177 * fVar155;
    fVar201 = auVar80._0_4_;
    fVar204 = auVar80._4_4_;
    fVar130 = auVar80._8_4_;
    fVar156 = auVar80._12_4_;
    fVar293 = auVar266._0_4_ * fVar201 + fVar220 * fVar184;
    fVar298 = auVar266._4_4_ * fVar204 + fVar221 * fVar203;
    fVar299 = auVar266._8_4_ * fVar130 + fVar222 * fVar152;
    fVar300 = auVar266._12_4_ * fVar156 + fVar307 * fVar178;
    fVar301 = auVar266._16_4_ * fVar201 + fVar220 * fVar183;
    fVar303 = auVar266._20_4_ * fVar204 + fVar221 * fVar153;
    fVar305 = auVar266._24_4_ * fVar130 + fVar222 * fVar155;
    auVar241 = vshufps_avx(auVar116,auVar116,0xaa);
    auVar197 = vshufps_avx(auVar116,auVar116,0xff);
    fVar157 = fVar154 + 0.0;
    auVar140 = vshufps_avx(auVar96,auVar96,0xaa);
    auVar100 = vshufps_avx(auVar96,auVar96,0xff);
    auVar88._0_4_ =
         fVar184 * (fVar179 * auVar266._0_4_ + auVar22._0_4_ * fVar184) + auVar266._0_4_ * fVar181;
    auVar88._4_4_ =
         fVar203 * (fVar182 * auVar266._4_4_ + auVar22._4_4_ * fVar203) + auVar266._4_4_ * fVar287;
    auVar88._8_4_ =
         fVar152 * (fVar177 * auVar266._8_4_ + auVar22._8_4_ * fVar152) + auVar266._8_4_ * fVar288;
    auVar88._12_4_ =
         fVar178 * (fVar180 * auVar266._12_4_ + fVar314 * fVar178) + auVar266._12_4_ * fVar289;
    auVar88._16_4_ =
         fVar183 * (fVar179 * auVar266._16_4_ + auVar22._0_4_ * fVar183) + auVar266._16_4_ * fVar290
    ;
    auVar88._20_4_ =
         fVar153 * (fVar182 * auVar266._20_4_ + auVar22._4_4_ * fVar153) + auVar266._20_4_ * fVar291
    ;
    auVar88._24_4_ =
         fVar155 * (fVar177 * auVar266._24_4_ + auVar22._8_4_ * fVar155) + auVar266._24_4_ * fVar292
    ;
    auVar88._28_4_ = fVar314 + 1.0 + fVar156;
    auVar148._0_4_ =
         fVar184 * (fVar220 * auVar266._0_4_ + fVar184 * (float)local_3d8._0_4_) +
         auVar266._0_4_ * fVar293;
    auVar148._4_4_ =
         fVar203 * (fVar221 * auVar266._4_4_ + fVar203 * (float)local_3d8._4_4_) +
         auVar266._4_4_ * fVar298;
    auVar148._8_4_ =
         fVar152 * (fVar222 * auVar266._8_4_ + fVar152 * fStack_3d0) + auVar266._8_4_ * fVar299;
    auVar148._12_4_ =
         fVar178 * (fVar307 * auVar266._12_4_ + fVar178 * fStack_3cc) + auVar266._12_4_ * fVar300;
    auVar148._16_4_ =
         fVar183 * (fVar220 * auVar266._16_4_ + fVar183 * (float)local_3d8._0_4_) +
         auVar266._16_4_ * fVar301;
    auVar148._20_4_ =
         fVar153 * (fVar221 * auVar266._20_4_ + fVar153 * (float)local_3d8._4_4_) +
         auVar266._20_4_ * fVar303;
    auVar148._24_4_ =
         fVar155 * (fVar222 * auVar266._24_4_ + fVar155 * fStack_3d0) + auVar266._24_4_ * fVar305;
    auVar148._28_4_ = fVar314 + 1.0 + fVar156;
    auVar173._0_4_ =
         fVar184 * fVar181 + auVar266._0_4_ * (auVar117._0_4_ * auVar266._0_4_ + fVar184 * fVar200);
    auVar173._4_4_ =
         fVar203 * fVar287 + auVar266._4_4_ * (auVar117._4_4_ * auVar266._4_4_ + fVar203 * fVar202);
    auVar173._8_4_ =
         fVar152 * fVar288 + auVar266._8_4_ * (auVar117._8_4_ * auVar266._8_4_ + fVar152 * fVar205);
    auVar173._12_4_ =
         fVar178 * fVar289 +
         auVar266._12_4_ * (auVar117._12_4_ * auVar266._12_4_ + fVar178 * fVar154);
    auVar173._16_4_ =
         fVar183 * fVar290 +
         auVar266._16_4_ * (auVar117._0_4_ * auVar266._16_4_ + fVar183 * fVar200);
    auVar173._20_4_ =
         fVar153 * fVar291 +
         auVar266._20_4_ * (auVar117._4_4_ * auVar266._20_4_ + fVar153 * fVar202);
    auVar173._24_4_ =
         fVar155 * fVar292 +
         auVar266._24_4_ * (auVar117._8_4_ * auVar266._24_4_ + fVar155 * fVar205);
    auVar173._28_4_ = fVar156 + fVar157;
    auVar278._0_4_ =
         fVar184 * fVar293 + auVar266._0_4_ * (auVar6._0_4_ * auVar266._0_4_ + fVar184 * fVar201);
    auVar278._4_4_ =
         fVar203 * fVar298 + auVar266._4_4_ * (auVar6._4_4_ * auVar266._4_4_ + fVar203 * fVar204);
    auVar278._8_4_ =
         fVar152 * fVar299 + auVar266._8_4_ * (auVar6._8_4_ * auVar266._8_4_ + fVar152 * fVar130);
    auVar278._12_4_ =
         fVar178 * fVar300 + auVar266._12_4_ * (auVar6._12_4_ * auVar266._12_4_ + fVar178 * fVar156)
    ;
    auVar278._16_4_ =
         fVar183 * fVar301 + auVar266._16_4_ * (auVar6._0_4_ * auVar266._16_4_ + fVar183 * fVar201);
    auVar278._20_4_ =
         fVar153 * fVar303 + auVar266._20_4_ * (auVar6._4_4_ * auVar266._20_4_ + fVar153 * fVar204);
    auVar278._24_4_ =
         fVar155 * fVar305 + auVar266._24_4_ * (auVar6._8_4_ * auVar266._24_4_ + fVar155 * fVar130);
    auVar278._28_4_ = fVar157 + fVar156 + 0.0;
    local_78._0_4_ = fVar184 * auVar88._0_4_ + auVar266._0_4_ * auVar173._0_4_;
    local_78._4_4_ = fVar203 * auVar88._4_4_ + auVar266._4_4_ * auVar173._4_4_;
    local_78._8_4_ = fVar152 * auVar88._8_4_ + auVar266._8_4_ * auVar173._8_4_;
    local_78._12_4_ = fVar178 * auVar88._12_4_ + auVar266._12_4_ * auVar173._12_4_;
    local_78._16_4_ = fVar183 * auVar88._16_4_ + auVar266._16_4_ * auVar173._16_4_;
    local_78._20_4_ = fVar153 * auVar88._20_4_ + auVar266._20_4_ * auVar173._20_4_;
    local_78._24_4_ = fVar155 * auVar88._24_4_ + auVar266._24_4_ * auVar173._24_4_;
    local_78._28_4_ = fVar314 + fVar180 + fVar156 + 0.0;
    local_98._0_4_ = fVar184 * auVar148._0_4_ + auVar266._0_4_ * auVar278._0_4_;
    local_98._4_4_ = fVar203 * auVar148._4_4_ + auVar266._4_4_ * auVar278._4_4_;
    local_98._8_4_ = fVar152 * auVar148._8_4_ + auVar266._8_4_ * auVar278._8_4_;
    local_98._12_4_ = fVar178 * auVar148._12_4_ + auVar266._12_4_ * auVar278._12_4_;
    local_98._16_4_ = fVar183 * auVar148._16_4_ + auVar266._16_4_ * auVar278._16_4_;
    local_98._20_4_ = fVar153 * auVar148._20_4_ + auVar266._20_4_ * auVar278._20_4_;
    local_98._24_4_ = fVar155 * auVar148._24_4_ + auVar266._24_4_ * auVar278._24_4_;
    local_98._28_4_ = fVar314 + fVar180 + fVar157;
    auVar15 = vsubps_avx(auVar173,auVar88);
    auVar82 = vsubps_avx(auVar278,auVar148);
    local_418._0_4_ = auVar101._0_4_;
    local_418._4_4_ = auVar101._4_4_;
    fStack_410 = auVar101._8_4_;
    fStack_40c = auVar101._12_4_;
    local_d8 = (float)local_418._0_4_ * auVar15._0_4_ * 3.0;
    fStack_d4 = (float)local_418._4_4_ * auVar15._4_4_ * 3.0;
    auVar25._4_4_ = fStack_d4;
    auVar25._0_4_ = local_d8;
    fStack_d0 = fStack_410 * auVar15._8_4_ * 3.0;
    auVar25._8_4_ = fStack_d0;
    fStack_cc = fStack_40c * auVar15._12_4_ * 3.0;
    auVar25._12_4_ = fStack_cc;
    fStack_c8 = (float)local_418._0_4_ * auVar15._16_4_ * 3.0;
    auVar25._16_4_ = fStack_c8;
    fStack_c4 = (float)local_418._4_4_ * auVar15._20_4_ * 3.0;
    auVar25._20_4_ = fStack_c4;
    fStack_c0 = fStack_410 * auVar15._24_4_ * 3.0;
    auVar25._24_4_ = fStack_c0;
    auVar25._28_4_ = auVar15._28_4_;
    fVar287 = (float)local_418._0_4_ * auVar82._0_4_ * 3.0;
    fVar177 = (float)local_418._4_4_ * auVar82._4_4_ * 3.0;
    auVar26._4_4_ = fVar177;
    auVar26._0_4_ = fVar287;
    fVar288 = fStack_410 * auVar82._8_4_ * 3.0;
    auVar26._8_4_ = fVar288;
    fVar180 = fStack_40c * auVar82._12_4_ * 3.0;
    auVar26._12_4_ = fVar180;
    fVar289 = (float)local_418._0_4_ * auVar82._16_4_ * 3.0;
    auVar26._16_4_ = fVar289;
    fVar290 = (float)local_418._4_4_ * auVar82._20_4_ * 3.0;
    auVar26._20_4_ = fVar290;
    fVar291 = fStack_410 * auVar82._24_4_ * 3.0;
    auVar26._24_4_ = fVar291;
    auVar26._28_4_ = auVar173._28_4_;
    auVar16 = vsubps_avx(local_78,auVar25);
    auVar82 = vperm2f128_avx(auVar16,auVar16,1);
    auVar82 = vshufps_avx(auVar82,auVar16,0x30);
    _local_3d8 = vshufps_avx(auVar16,auVar82,0x29);
    auVar16 = vsubps_avx(local_98,auVar26);
    auVar82 = vperm2f128_avx(auVar16,auVar16,1);
    auVar82 = vshufps_avx(auVar82,auVar16,0x30);
    _local_478 = vshufps_avx(auVar16,auVar82,0x29);
    fVar316 = auVar140._0_4_;
    fVar320 = auVar140._4_4_;
    fVar321 = auVar140._8_4_;
    fVar200 = auVar100._0_4_;
    fVar204 = auVar100._4_4_;
    fVar154 = auVar100._8_4_;
    fVar179 = auVar100._12_4_;
    fVar315 = auVar197._12_4_;
    auVar101 = vshufps_avx(auVar227,auVar227,0xaa);
    fVar201 = auVar101._0_4_;
    fVar205 = auVar101._4_4_;
    fVar156 = auVar101._8_4_;
    fVar181 = auVar101._12_4_;
    fVar300 = auVar266._0_4_ * fVar201 + fVar316 * fVar184;
    fVar301 = auVar266._4_4_ * fVar205 + fVar320 * fVar203;
    fVar303 = auVar266._8_4_ * fVar156 + fVar321 * fVar152;
    fVar305 = auVar266._12_4_ * fVar181 + auVar140._12_4_ * fVar178;
    fVar302 = auVar266._16_4_ * fVar201 + fVar316 * fVar183;
    fVar304 = auVar266._20_4_ * fVar205 + fVar320 * fVar153;
    fVar306 = auVar266._24_4_ * fVar156 + fVar321 * fVar155;
    fVar307 = fVar315 + fVar314 + fVar307;
    auVar101 = vshufps_avx(auVar227,auVar227,0xff);
    fVar202 = auVar101._0_4_;
    fVar130 = auVar101._4_4_;
    fVar157 = auVar101._8_4_;
    fVar182 = auVar101._12_4_;
    fVar292 = auVar266._0_4_ * fVar202 + fVar184 * fVar200;
    fVar220 = auVar266._4_4_ * fVar130 + fVar203 * fVar204;
    fVar293 = auVar266._8_4_ * fVar157 + fVar152 * fVar154;
    fVar221 = auVar266._12_4_ * fVar182 + fVar178 * fVar179;
    fVar298 = auVar266._16_4_ * fVar202 + fVar183 * fVar200;
    fVar222 = auVar266._20_4_ * fVar130 + fVar153 * fVar204;
    fVar299 = auVar266._24_4_ * fVar157 + fVar155 * fVar154;
    auVar101 = vshufps_avx(auVar133,auVar133,0xaa);
    auVar22 = vshufps_avx(auVar133,auVar133,0xff);
    fVar314 = auVar22._12_4_;
    auVar89._0_4_ =
         auVar266._0_4_ * fVar300 + fVar184 * (fVar316 * auVar266._0_4_ + auVar241._0_4_ * fVar184);
    auVar89._4_4_ =
         auVar266._4_4_ * fVar301 + fVar203 * (fVar320 * auVar266._4_4_ + auVar241._4_4_ * fVar203);
    auVar89._8_4_ =
         auVar266._8_4_ * fVar303 + fVar152 * (fVar321 * auVar266._8_4_ + auVar241._8_4_ * fVar152);
    auVar89._12_4_ =
         auVar266._12_4_ * fVar305 +
         fVar178 * (auVar140._12_4_ * auVar266._12_4_ + auVar241._12_4_ * fVar178);
    auVar89._16_4_ =
         auVar266._16_4_ * fVar302 +
         fVar183 * (fVar316 * auVar266._16_4_ + auVar241._0_4_ * fVar183);
    auVar89._20_4_ =
         auVar266._20_4_ * fVar304 +
         fVar153 * (fVar320 * auVar266._20_4_ + auVar241._4_4_ * fVar153);
    auVar89._24_4_ =
         auVar266._24_4_ * fVar306 +
         fVar155 * (fVar321 * auVar266._24_4_ + auVar241._8_4_ * fVar155);
    auVar89._28_4_ = fVar314 + auVar16._28_4_ + auVar82._28_4_;
    auVar313._0_4_ =
         auVar266._0_4_ * fVar292 + fVar184 * (auVar266._0_4_ * fVar200 + auVar197._0_4_ * fVar184);
    auVar313._4_4_ =
         auVar266._4_4_ * fVar220 + fVar203 * (auVar266._4_4_ * fVar204 + auVar197._4_4_ * fVar203);
    auVar313._8_4_ =
         auVar266._8_4_ * fVar293 + fVar152 * (auVar266._8_4_ * fVar154 + auVar197._8_4_ * fVar152);
    auVar313._12_4_ =
         auVar266._12_4_ * fVar221 + fVar178 * (auVar266._12_4_ * fVar179 + fVar315 * fVar178);
    auVar313._16_4_ =
         auVar266._16_4_ * fVar298 +
         fVar183 * (auVar266._16_4_ * fVar200 + auVar197._0_4_ * fVar183);
    auVar313._20_4_ =
         auVar266._20_4_ * fVar222 +
         fVar153 * (auVar266._20_4_ * fVar204 + auVar197._4_4_ * fVar153);
    auVar313._24_4_ =
         auVar266._24_4_ * fVar299 +
         fVar155 * (auVar266._24_4_ * fVar154 + auVar197._8_4_ * fVar155);
    auVar313._28_4_ = fVar314 + auVar82._28_4_ + auVar173._28_4_;
    auVar82 = vperm2f128_avx(local_78,local_78,1);
    auVar82 = vshufps_avx(auVar82,local_78,0x30);
    _local_308 = vshufps_avx(local_78,auVar82,0x29);
    auVar174._0_4_ =
         fVar184 * fVar300 + auVar266._0_4_ * (auVar101._0_4_ * auVar266._0_4_ + fVar184 * fVar201);
    auVar174._4_4_ =
         fVar203 * fVar301 + auVar266._4_4_ * (auVar101._4_4_ * auVar266._4_4_ + fVar203 * fVar205);
    auVar174._8_4_ =
         fVar152 * fVar303 + auVar266._8_4_ * (auVar101._8_4_ * auVar266._8_4_ + fVar152 * fVar156);
    auVar174._12_4_ =
         fVar178 * fVar305 +
         auVar266._12_4_ * (auVar101._12_4_ * auVar266._12_4_ + fVar178 * fVar181);
    auVar174._16_4_ =
         fVar183 * fVar302 +
         auVar266._16_4_ * (auVar101._0_4_ * auVar266._16_4_ + fVar183 * fVar201);
    auVar174._20_4_ =
         fVar153 * fVar304 +
         auVar266._20_4_ * (auVar101._4_4_ * auVar266._20_4_ + fVar153 * fVar205);
    auVar174._24_4_ =
         fVar155 * fVar306 +
         auVar266._24_4_ * (auVar101._8_4_ * auVar266._24_4_ + fVar155 * fVar156);
    auVar174._28_4_ = fVar307 + auVar101._12_4_ + fVar181;
    auVar219._0_4_ =
         fVar184 * fVar292 + auVar266._0_4_ * (auVar22._0_4_ * auVar266._0_4_ + fVar184 * fVar202);
    auVar219._4_4_ =
         fVar203 * fVar220 + auVar266._4_4_ * (auVar22._4_4_ * auVar266._4_4_ + fVar203 * fVar130);
    auVar219._8_4_ =
         fVar152 * fVar293 + auVar266._8_4_ * (auVar22._8_4_ * auVar266._8_4_ + fVar152 * fVar157);
    auVar219._12_4_ =
         fVar178 * fVar221 + auVar266._12_4_ * (fVar314 * auVar266._12_4_ + fVar178 * fVar182);
    auVar219._16_4_ =
         fVar183 * fVar298 + auVar266._16_4_ * (auVar22._0_4_ * auVar266._16_4_ + fVar183 * fVar202)
    ;
    auVar219._20_4_ =
         fVar153 * fVar222 + auVar266._20_4_ * (auVar22._4_4_ * auVar266._20_4_ + fVar153 * fVar130)
    ;
    auVar219._24_4_ =
         fVar155 * fVar299 + auVar266._24_4_ * (auVar22._8_4_ * auVar266._24_4_ + fVar155 * fVar157)
    ;
    auVar219._28_4_ = fVar315 + fVar179 + fVar314 + fVar182;
    auVar236._0_4_ = fVar184 * auVar89._0_4_ + auVar266._0_4_ * auVar174._0_4_;
    auVar236._4_4_ = fVar203 * auVar89._4_4_ + auVar266._4_4_ * auVar174._4_4_;
    auVar236._8_4_ = fVar152 * auVar89._8_4_ + auVar266._8_4_ * auVar174._8_4_;
    auVar236._12_4_ = fVar178 * auVar89._12_4_ + auVar266._12_4_ * auVar174._12_4_;
    auVar236._16_4_ = fVar183 * auVar89._16_4_ + auVar266._16_4_ * auVar174._16_4_;
    auVar236._20_4_ = fVar153 * auVar89._20_4_ + auVar266._20_4_ * auVar174._20_4_;
    auVar236._24_4_ = fVar155 * auVar89._24_4_ + auVar266._24_4_ * auVar174._24_4_;
    auVar236._28_4_ = fVar307 + fVar314 + fVar182;
    auVar254._0_4_ = fVar184 * auVar313._0_4_ + auVar266._0_4_ * auVar219._0_4_;
    auVar254._4_4_ = fVar203 * auVar313._4_4_ + auVar266._4_4_ * auVar219._4_4_;
    auVar254._8_4_ = fVar152 * auVar313._8_4_ + auVar266._8_4_ * auVar219._8_4_;
    auVar254._12_4_ = fVar178 * auVar313._12_4_ + auVar266._12_4_ * auVar219._12_4_;
    auVar254._16_4_ = fVar183 * auVar313._16_4_ + auVar266._16_4_ * auVar219._16_4_;
    auVar254._20_4_ = fVar153 * auVar313._20_4_ + auVar266._20_4_ * auVar219._20_4_;
    auVar254._24_4_ = fVar155 * auVar313._24_4_ + auVar266._24_4_ * auVar219._24_4_;
    auVar254._28_4_ = auVar14._28_4_ + auVar266._28_4_;
    auVar82 = vsubps_avx(auVar174,auVar89);
    auVar14 = vsubps_avx(auVar219,auVar313);
    local_f8 = (float)local_418._0_4_ * auVar82._0_4_ * 3.0;
    fStack_f4 = (float)local_418._4_4_ * auVar82._4_4_ * 3.0;
    auVar27._4_4_ = fStack_f4;
    auVar27._0_4_ = local_f8;
    fStack_f0 = fStack_410 * auVar82._8_4_ * 3.0;
    auVar27._8_4_ = fStack_f0;
    fStack_ec = fStack_40c * auVar82._12_4_ * 3.0;
    auVar27._12_4_ = fStack_ec;
    fStack_e8 = (float)local_418._0_4_ * auVar82._16_4_ * 3.0;
    auVar27._16_4_ = fStack_e8;
    fStack_e4 = (float)local_418._4_4_ * auVar82._20_4_ * 3.0;
    auVar27._20_4_ = fStack_e4;
    fStack_e0 = fStack_410 * auVar82._24_4_ * 3.0;
    auVar27._24_4_ = fStack_e0;
    auVar27._28_4_ = auVar219._28_4_;
    local_118 = (float)local_418._0_4_ * auVar14._0_4_ * 3.0;
    fStack_114 = (float)local_418._4_4_ * auVar14._4_4_ * 3.0;
    auVar28._4_4_ = fStack_114;
    auVar28._0_4_ = local_118;
    fStack_110 = fStack_410 * auVar14._8_4_ * 3.0;
    auVar28._8_4_ = fStack_110;
    fStack_10c = fStack_40c * auVar14._12_4_ * 3.0;
    auVar28._12_4_ = fStack_10c;
    fStack_108 = (float)local_418._0_4_ * auVar14._16_4_ * 3.0;
    auVar28._16_4_ = fStack_108;
    fStack_104 = (float)local_418._4_4_ * auVar14._20_4_ * 3.0;
    auVar28._20_4_ = fStack_104;
    fStack_410 = fStack_410 * auVar14._24_4_ * 3.0;
    auVar28._24_4_ = fStack_410;
    auVar28._28_4_ = fStack_40c;
    auVar82 = vperm2f128_avx(auVar236,auVar236,1);
    auVar82 = vshufps_avx(auVar82,auVar236,0x30);
    auVar18 = vshufps_avx(auVar236,auVar82,0x29);
    auVar14 = vsubps_avx(auVar236,auVar27);
    auVar82 = vperm2f128_avx(auVar14,auVar14,1);
    auVar82 = vshufps_avx(auVar82,auVar14,0x30);
    auVar19 = vshufps_avx(auVar14,auVar82,0x29);
    auVar14 = vsubps_avx(auVar254,auVar28);
    auVar82 = vperm2f128_avx(auVar14,auVar14,1);
    auVar82 = vshufps_avx(auVar82,auVar14,0x30);
    auVar20 = vshufps_avx(auVar14,auVar82,0x29);
    auVar16 = vsubps_avx(auVar236,local_78);
    auVar17 = vsubps_avx(auVar18,_local_308);
    fVar184 = auVar17._0_4_ + auVar16._0_4_;
    fVar200 = auVar17._4_4_ + auVar16._4_4_;
    fVar201 = auVar17._8_4_ + auVar16._8_4_;
    fVar202 = auVar17._12_4_ + auVar16._12_4_;
    fVar203 = auVar17._16_4_ + auVar16._16_4_;
    fVar204 = auVar17._20_4_ + auVar16._20_4_;
    fVar205 = auVar17._24_4_ + auVar16._24_4_;
    auVar14 = vperm2f128_avx(local_98,local_98,1);
    auVar14 = vshufps_avx(auVar14,local_98,0x30);
    local_b8 = vshufps_avx(local_98,auVar14,0x29);
    auVar14 = vperm2f128_avx(auVar254,auVar254,1);
    auVar14 = vshufps_avx(auVar14,auVar254,0x30);
    auVar21 = vshufps_avx(auVar254,auVar14,0x29);
    auVar14 = vsubps_avx(auVar254,local_98);
    auVar23 = vsubps_avx(auVar21,local_b8);
    fVar130 = auVar14._0_4_ + auVar23._0_4_;
    fVar152 = auVar14._4_4_ + auVar23._4_4_;
    fVar154 = auVar14._8_4_ + auVar23._8_4_;
    fVar156 = auVar14._12_4_ + auVar23._12_4_;
    fVar157 = auVar14._16_4_ + auVar23._16_4_;
    fVar178 = auVar14._20_4_ + auVar23._20_4_;
    fVar179 = auVar14._24_4_ + auVar23._24_4_;
    fVar181 = auVar14._28_4_;
    auVar29._4_4_ = local_98._4_4_ * fVar200;
    auVar29._0_4_ = local_98._0_4_ * fVar184;
    auVar29._8_4_ = local_98._8_4_ * fVar201;
    auVar29._12_4_ = local_98._12_4_ * fVar202;
    auVar29._16_4_ = local_98._16_4_ * fVar203;
    auVar29._20_4_ = local_98._20_4_ * fVar204;
    auVar29._24_4_ = local_98._24_4_ * fVar205;
    auVar29._28_4_ = fVar181;
    auVar30._4_4_ = fVar152 * local_78._4_4_;
    auVar30._0_4_ = fVar130 * local_78._0_4_;
    auVar30._8_4_ = fVar154 * local_78._8_4_;
    auVar30._12_4_ = fVar156 * local_78._12_4_;
    auVar30._16_4_ = fVar157 * local_78._16_4_;
    auVar30._20_4_ = fVar178 * local_78._20_4_;
    auVar30._24_4_ = fVar179 * local_78._24_4_;
    auVar30._28_4_ = auVar82._28_4_;
    auVar82 = vsubps_avx(auVar29,auVar30);
    local_d8 = local_78._0_4_ + local_d8;
    fStack_d4 = local_78._4_4_ + fStack_d4;
    fStack_d0 = local_78._8_4_ + fStack_d0;
    fStack_cc = local_78._12_4_ + fStack_cc;
    fStack_c8 = local_78._16_4_ + fStack_c8;
    fStack_c4 = local_78._20_4_ + fStack_c4;
    fStack_c0 = local_78._24_4_ + fStack_c0;
    fStack_bc = local_78._28_4_ + auVar15._28_4_;
    fVar287 = local_98._0_4_ + fVar287;
    fVar177 = local_98._4_4_ + fVar177;
    fVar288 = local_98._8_4_ + fVar288;
    fVar180 = local_98._12_4_ + fVar180;
    fVar289 = local_98._16_4_ + fVar289;
    fVar290 = local_98._20_4_ + fVar290;
    fVar291 = local_98._24_4_ + fVar291;
    auVar31._4_4_ = fVar177 * fVar200;
    auVar31._0_4_ = fVar287 * fVar184;
    auVar31._8_4_ = fVar288 * fVar201;
    auVar31._12_4_ = fVar180 * fVar202;
    auVar31._16_4_ = fVar289 * fVar203;
    auVar31._20_4_ = fVar290 * fVar204;
    auVar31._24_4_ = fVar291 * fVar205;
    auVar31._28_4_ = fVar181;
    auVar32._4_4_ = fVar152 * fStack_d4;
    auVar32._0_4_ = fVar130 * local_d8;
    auVar32._8_4_ = fVar154 * fStack_d0;
    auVar32._12_4_ = fVar156 * fStack_cc;
    auVar32._16_4_ = fVar157 * fStack_c8;
    auVar32._20_4_ = fVar178 * fStack_c4;
    auVar32._24_4_ = fVar179 * fStack_c0;
    auVar32._28_4_ = fStack_bc;
    auVar15 = vsubps_avx(auVar31,auVar32);
    auVar33._4_4_ = local_478._4_4_ * fVar200;
    auVar33._0_4_ = local_478._0_4_ * fVar184;
    auVar33._8_4_ = local_478._8_4_ * fVar201;
    auVar33._12_4_ = local_478._12_4_ * fVar202;
    auVar33._16_4_ = local_478._16_4_ * fVar203;
    auVar33._20_4_ = local_478._20_4_ * fVar204;
    auVar33._24_4_ = local_478._24_4_ * fVar205;
    auVar33._28_4_ = fVar181;
    auVar34._4_4_ = fVar152 * (float)local_3d8._4_4_;
    auVar34._0_4_ = fVar130 * (float)local_3d8._0_4_;
    auVar34._8_4_ = fVar154 * fStack_3d0;
    auVar34._12_4_ = fVar156 * fStack_3cc;
    auVar34._16_4_ = fVar157 * fStack_3c8;
    auVar34._20_4_ = fVar178 * fStack_3c4;
    auVar34._24_4_ = fVar179 * fStack_3c0;
    auVar34._28_4_ = 0x40400000;
    auVar24 = vsubps_avx(auVar33,auVar34);
    auVar35._4_4_ = local_b8._4_4_ * fVar200;
    auVar35._0_4_ = local_b8._0_4_ * fVar184;
    auVar35._8_4_ = local_b8._8_4_ * fVar201;
    auVar35._12_4_ = local_b8._12_4_ * fVar202;
    auVar35._16_4_ = local_b8._16_4_ * fVar203;
    auVar35._20_4_ = local_b8._20_4_ * fVar204;
    auVar35._24_4_ = local_b8._24_4_ * fVar205;
    auVar35._28_4_ = fVar181;
    auVar36._4_4_ = local_308._4_4_ * fVar152;
    auVar36._0_4_ = local_308._0_4_ * fVar130;
    auVar36._8_4_ = local_308._8_4_ * fVar154;
    auVar36._12_4_ = local_308._12_4_ * fVar156;
    auVar36._16_4_ = local_308._16_4_ * fVar157;
    auVar36._20_4_ = local_308._20_4_ * fVar178;
    auVar36._24_4_ = local_308._24_4_ * fVar179;
    auVar36._28_4_ = local_b8._28_4_;
    auVar83 = vsubps_avx(auVar35,auVar36);
    auVar37._4_4_ = auVar254._4_4_ * fVar200;
    auVar37._0_4_ = auVar254._0_4_ * fVar184;
    auVar37._8_4_ = auVar254._8_4_ * fVar201;
    auVar37._12_4_ = auVar254._12_4_ * fVar202;
    auVar37._16_4_ = auVar254._16_4_ * fVar203;
    auVar37._20_4_ = auVar254._20_4_ * fVar204;
    auVar37._24_4_ = auVar254._24_4_ * fVar205;
    auVar37._28_4_ = fVar181;
    auVar38._4_4_ = fVar152 * auVar236._4_4_;
    auVar38._0_4_ = fVar130 * auVar236._0_4_;
    auVar38._8_4_ = fVar154 * auVar236._8_4_;
    auVar38._12_4_ = fVar156 * auVar236._12_4_;
    auVar38._16_4_ = fVar157 * auVar236._16_4_;
    auVar38._20_4_ = fVar178 * auVar236._20_4_;
    auVar38._24_4_ = fVar179 * auVar236._24_4_;
    auVar38._28_4_ = local_478._28_4_;
    auVar84 = vsubps_avx(auVar37,auVar38);
    local_f8 = auVar236._0_4_ + local_f8;
    fStack_f4 = auVar236._4_4_ + fStack_f4;
    fStack_f0 = auVar236._8_4_ + fStack_f0;
    fStack_ec = auVar236._12_4_ + fStack_ec;
    fStack_e8 = auVar236._16_4_ + fStack_e8;
    fStack_e4 = auVar236._20_4_ + fStack_e4;
    fStack_e0 = auVar236._24_4_ + fStack_e0;
    fStack_dc = auVar236._28_4_ + auVar219._28_4_;
    local_118 = auVar254._0_4_ + local_118;
    fStack_114 = auVar254._4_4_ + fStack_114;
    fStack_110 = auVar254._8_4_ + fStack_110;
    fStack_10c = auVar254._12_4_ + fStack_10c;
    fStack_108 = auVar254._16_4_ + fStack_108;
    fStack_104 = auVar254._20_4_ + fStack_104;
    fStack_100 = auVar254._24_4_ + fStack_410;
    fStack_fc = auVar254._28_4_ + fStack_40c;
    auVar39._4_4_ = fStack_114 * fVar200;
    auVar39._0_4_ = local_118 * fVar184;
    auVar39._8_4_ = fStack_110 * fVar201;
    auVar39._12_4_ = fStack_10c * fVar202;
    auVar39._16_4_ = fStack_108 * fVar203;
    auVar39._20_4_ = fStack_104 * fVar204;
    auVar39._24_4_ = fStack_100 * fVar205;
    auVar39._28_4_ = auVar254._28_4_ + fStack_40c;
    auVar40._4_4_ = fStack_f4 * fVar152;
    auVar40._0_4_ = local_f8 * fVar130;
    auVar40._8_4_ = fStack_f0 * fVar154;
    auVar40._12_4_ = fStack_ec * fVar156;
    auVar40._16_4_ = fStack_e8 * fVar157;
    auVar40._20_4_ = fStack_e4 * fVar178;
    auVar40._24_4_ = fStack_e0 * fVar179;
    auVar40._28_4_ = fStack_dc;
    auVar85 = vsubps_avx(auVar39,auVar40);
    auVar41._4_4_ = auVar20._4_4_ * fVar200;
    auVar41._0_4_ = auVar20._0_4_ * fVar184;
    auVar41._8_4_ = auVar20._8_4_ * fVar201;
    auVar41._12_4_ = auVar20._12_4_ * fVar202;
    auVar41._16_4_ = auVar20._16_4_ * fVar203;
    auVar41._20_4_ = auVar20._20_4_ * fVar204;
    auVar41._24_4_ = auVar20._24_4_ * fVar205;
    auVar41._28_4_ = fStack_dc;
    auVar42._4_4_ = fVar152 * auVar19._4_4_;
    auVar42._0_4_ = fVar130 * auVar19._0_4_;
    auVar42._8_4_ = fVar154 * auVar19._8_4_;
    auVar42._12_4_ = fVar156 * auVar19._12_4_;
    auVar42._16_4_ = fVar157 * auVar19._16_4_;
    auVar42._20_4_ = fVar178 * auVar19._20_4_;
    auVar42._24_4_ = fVar179 * auVar19._24_4_;
    auVar42._28_4_ = auVar19._28_4_;
    auVar110 = vsubps_avx(auVar41,auVar42);
    auVar43._4_4_ = auVar21._4_4_ * fVar200;
    auVar43._0_4_ = auVar21._0_4_ * fVar184;
    auVar43._8_4_ = auVar21._8_4_ * fVar201;
    auVar43._12_4_ = auVar21._12_4_ * fVar202;
    auVar43._16_4_ = auVar21._16_4_ * fVar203;
    auVar43._20_4_ = auVar21._20_4_ * fVar204;
    auVar43._24_4_ = auVar21._24_4_ * fVar205;
    auVar43._28_4_ = auVar17._28_4_ + auVar16._28_4_;
    auVar44._4_4_ = auVar18._4_4_ * fVar152;
    auVar44._0_4_ = auVar18._0_4_ * fVar130;
    auVar44._8_4_ = auVar18._8_4_ * fVar154;
    auVar44._12_4_ = auVar18._12_4_ * fVar156;
    auVar44._16_4_ = auVar18._16_4_ * fVar157;
    auVar44._20_4_ = auVar18._20_4_ * fVar178;
    auVar44._24_4_ = auVar18._24_4_ * fVar179;
    auVar44._28_4_ = fVar181 + auVar23._28_4_;
    auVar23 = vsubps_avx(auVar43,auVar44);
    auVar14 = vminps_avx(auVar82,auVar15);
    auVar82 = vmaxps_avx(auVar82,auVar15);
    auVar15 = vminps_avx(auVar24,auVar83);
    auVar15 = vminps_avx(auVar14,auVar15);
    auVar14 = vmaxps_avx(auVar24,auVar83);
    auVar82 = vmaxps_avx(auVar82,auVar14);
    auVar16 = vminps_avx(auVar84,auVar85);
    auVar14 = vmaxps_avx(auVar84,auVar85);
    auVar17 = vminps_avx(auVar110,auVar23);
    auVar16 = vminps_avx(auVar16,auVar17);
    auVar16 = vminps_avx(auVar15,auVar16);
    auVar15 = vmaxps_avx(auVar110,auVar23);
    auVar14 = vmaxps_avx(auVar14,auVar15);
    auVar14 = vmaxps_avx(auVar82,auVar14);
    auVar82 = vcmpps_avx(auVar16,local_138,2);
    auVar14 = vcmpps_avx(auVar14,local_158,5);
    auVar82 = vandps_avx(auVar14,auVar82);
    auVar14 = local_1b8 & auVar82;
    uVar68 = 0;
    if ((((((((auVar14 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar14 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar14 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar14 >> 0x7f,0) != '\0') ||
          (auVar14 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar14 >> 0xbf,0) != '\0') ||
        (auVar14 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar14[0x1f] < '\0')
    {
      auVar14 = vsubps_avx(_local_308,local_78);
      auVar15 = vsubps_avx(auVar18,auVar236);
      fVar200 = auVar14._0_4_ + auVar15._0_4_;
      fVar201 = auVar14._4_4_ + auVar15._4_4_;
      fVar202 = auVar14._8_4_ + auVar15._8_4_;
      fVar203 = auVar14._12_4_ + auVar15._12_4_;
      fVar204 = auVar14._16_4_ + auVar15._16_4_;
      fVar205 = auVar14._20_4_ + auVar15._20_4_;
      fVar130 = auVar14._24_4_ + auVar15._24_4_;
      auVar16 = vsubps_avx(local_b8,local_98);
      auVar17 = vsubps_avx(auVar21,auVar254);
      fVar152 = auVar16._0_4_ + auVar17._0_4_;
      fVar154 = auVar16._4_4_ + auVar17._4_4_;
      fVar156 = auVar16._8_4_ + auVar17._8_4_;
      fVar157 = auVar16._12_4_ + auVar17._12_4_;
      fVar178 = auVar16._16_4_ + auVar17._16_4_;
      fVar179 = auVar16._20_4_ + auVar17._20_4_;
      fVar181 = auVar16._24_4_ + auVar17._24_4_;
      fVar184 = auVar17._28_4_;
      auVar45._4_4_ = local_98._4_4_ * fVar201;
      auVar45._0_4_ = local_98._0_4_ * fVar200;
      auVar45._8_4_ = local_98._8_4_ * fVar202;
      auVar45._12_4_ = local_98._12_4_ * fVar203;
      auVar45._16_4_ = local_98._16_4_ * fVar204;
      auVar45._20_4_ = local_98._20_4_ * fVar205;
      auVar45._24_4_ = local_98._24_4_ * fVar130;
      auVar45._28_4_ = local_98._28_4_;
      auVar46._4_4_ = local_78._4_4_ * fVar154;
      auVar46._0_4_ = local_78._0_4_ * fVar152;
      auVar46._8_4_ = local_78._8_4_ * fVar156;
      auVar46._12_4_ = local_78._12_4_ * fVar157;
      auVar46._16_4_ = local_78._16_4_ * fVar178;
      auVar46._20_4_ = local_78._20_4_ * fVar179;
      auVar46._24_4_ = local_78._24_4_ * fVar181;
      auVar46._28_4_ = local_78._28_4_;
      auVar17 = vsubps_avx(auVar45,auVar46);
      auVar47._4_4_ = fVar177 * fVar201;
      auVar47._0_4_ = fVar287 * fVar200;
      auVar47._8_4_ = fVar288 * fVar202;
      auVar47._12_4_ = fVar180 * fVar203;
      auVar47._16_4_ = fVar289 * fVar204;
      auVar47._20_4_ = fVar290 * fVar205;
      auVar47._24_4_ = fVar291 * fVar130;
      auVar47._28_4_ = local_98._28_4_;
      auVar48._4_4_ = fVar154 * fStack_d4;
      auVar48._0_4_ = fVar152 * local_d8;
      auVar48._8_4_ = fVar156 * fStack_d0;
      auVar48._12_4_ = fVar157 * fStack_cc;
      auVar48._16_4_ = fVar178 * fStack_c8;
      auVar48._20_4_ = fVar179 * fStack_c4;
      auVar48._24_4_ = fVar181 * fStack_c0;
      auVar48._28_4_ = fVar184;
      auVar23 = vsubps_avx(auVar47,auVar48);
      auVar49._4_4_ = fVar201 * local_478._4_4_;
      auVar49._0_4_ = fVar200 * local_478._0_4_;
      auVar49._8_4_ = fVar202 * local_478._8_4_;
      auVar49._12_4_ = fVar203 * local_478._12_4_;
      auVar49._16_4_ = fVar204 * local_478._16_4_;
      auVar49._20_4_ = fVar205 * local_478._20_4_;
      auVar49._24_4_ = fVar130 * local_478._24_4_;
      auVar49._28_4_ = fVar184;
      auVar50._4_4_ = fVar154 * (float)local_3d8._4_4_;
      auVar50._0_4_ = fVar152 * (float)local_3d8._0_4_;
      auVar50._8_4_ = fVar156 * fStack_3d0;
      auVar50._12_4_ = fVar157 * fStack_3cc;
      auVar50._16_4_ = fVar178 * fStack_3c8;
      auVar50._20_4_ = fVar179 * fStack_3c4;
      auVar50._24_4_ = fVar181 * fStack_3c0;
      auVar50._28_4_ = local_98._28_4_ + auVar173._28_4_;
      auVar24 = vsubps_avx(auVar49,auVar50);
      auVar51._4_4_ = local_b8._4_4_ * fVar201;
      auVar51._0_4_ = local_b8._0_4_ * fVar200;
      auVar51._8_4_ = local_b8._8_4_ * fVar202;
      auVar51._12_4_ = local_b8._12_4_ * fVar203;
      auVar51._16_4_ = local_b8._16_4_ * fVar204;
      auVar51._20_4_ = local_b8._20_4_ * fVar205;
      auVar51._24_4_ = local_b8._24_4_ * fVar130;
      auVar51._28_4_ = local_98._28_4_ + auVar173._28_4_;
      auVar52._4_4_ = local_308._4_4_ * fVar154;
      auVar52._0_4_ = local_308._0_4_ * fVar152;
      auVar52._8_4_ = local_308._8_4_ * fVar156;
      auVar52._12_4_ = local_308._12_4_ * fVar157;
      auVar52._16_4_ = local_308._16_4_ * fVar178;
      auVar52._20_4_ = local_308._20_4_ * fVar179;
      uVar2 = local_308._28_4_;
      auVar52._24_4_ = local_308._24_4_ * fVar181;
      auVar52._28_4_ = uVar2;
      auVar83 = vsubps_avx(auVar51,auVar52);
      auVar53._4_4_ = auVar254._4_4_ * fVar201;
      auVar53._0_4_ = auVar254._0_4_ * fVar200;
      auVar53._8_4_ = auVar254._8_4_ * fVar202;
      auVar53._12_4_ = auVar254._12_4_ * fVar203;
      auVar53._16_4_ = auVar254._16_4_ * fVar204;
      auVar53._20_4_ = auVar254._20_4_ * fVar205;
      auVar53._24_4_ = auVar254._24_4_ * fVar130;
      auVar53._28_4_ = auVar254._28_4_;
      auVar54._4_4_ = auVar236._4_4_ * fVar154;
      auVar54._0_4_ = auVar236._0_4_ * fVar152;
      auVar54._8_4_ = auVar236._8_4_ * fVar156;
      auVar54._12_4_ = auVar236._12_4_ * fVar157;
      auVar54._16_4_ = auVar236._16_4_ * fVar178;
      auVar54._20_4_ = auVar236._20_4_ * fVar179;
      auVar54._24_4_ = auVar236._24_4_ * fVar181;
      auVar54._28_4_ = auVar236._28_4_;
      auVar84 = vsubps_avx(auVar53,auVar54);
      auVar55._4_4_ = fVar201 * fStack_114;
      auVar55._0_4_ = fVar200 * local_118;
      auVar55._8_4_ = fVar202 * fStack_110;
      auVar55._12_4_ = fVar203 * fStack_10c;
      auVar55._16_4_ = fVar204 * fStack_108;
      auVar55._20_4_ = fVar205 * fStack_104;
      auVar55._24_4_ = fVar130 * fStack_100;
      auVar55._28_4_ = auVar254._28_4_;
      auVar56._4_4_ = fVar154 * fStack_f4;
      auVar56._0_4_ = fVar152 * local_f8;
      auVar56._8_4_ = fVar156 * fStack_f0;
      auVar56._12_4_ = fVar157 * fStack_ec;
      auVar56._16_4_ = fVar178 * fStack_e8;
      auVar56._20_4_ = fVar179 * fStack_e4;
      auVar56._24_4_ = fVar181 * fStack_e0;
      auVar56._28_4_ = uVar2;
      auVar85 = vsubps_avx(auVar55,auVar56);
      auVar57._4_4_ = fVar201 * auVar20._4_4_;
      auVar57._0_4_ = fVar200 * auVar20._0_4_;
      auVar57._8_4_ = fVar202 * auVar20._8_4_;
      auVar57._12_4_ = fVar203 * auVar20._12_4_;
      auVar57._16_4_ = fVar204 * auVar20._16_4_;
      auVar57._20_4_ = fVar205 * auVar20._20_4_;
      auVar57._24_4_ = fVar130 * auVar20._24_4_;
      auVar57._28_4_ = uVar2;
      auVar58._4_4_ = fVar154 * auVar19._4_4_;
      auVar58._0_4_ = fVar152 * auVar19._0_4_;
      auVar58._8_4_ = fVar156 * auVar19._8_4_;
      auVar58._12_4_ = fVar157 * auVar19._12_4_;
      auVar58._16_4_ = fVar178 * auVar19._16_4_;
      auVar58._20_4_ = fVar179 * auVar19._20_4_;
      auVar58._24_4_ = fVar181 * auVar19._24_4_;
      auVar58._28_4_ = local_b8._28_4_;
      auVar19 = vsubps_avx(auVar57,auVar58);
      auVar59._4_4_ = auVar21._4_4_ * fVar201;
      auVar59._0_4_ = auVar21._0_4_ * fVar200;
      auVar59._8_4_ = auVar21._8_4_ * fVar202;
      auVar59._12_4_ = auVar21._12_4_ * fVar203;
      auVar59._16_4_ = auVar21._16_4_ * fVar204;
      auVar59._20_4_ = auVar21._20_4_ * fVar205;
      auVar59._24_4_ = auVar21._24_4_ * fVar130;
      auVar59._28_4_ = auVar14._28_4_ + auVar15._28_4_;
      auVar60._4_4_ = auVar18._4_4_ * fVar154;
      auVar60._0_4_ = auVar18._0_4_ * fVar152;
      auVar60._8_4_ = auVar18._8_4_ * fVar156;
      auVar60._12_4_ = auVar18._12_4_ * fVar157;
      auVar60._16_4_ = auVar18._16_4_ * fVar178;
      auVar60._20_4_ = auVar18._20_4_ * fVar179;
      auVar60._24_4_ = auVar18._24_4_ * fVar181;
      auVar60._28_4_ = auVar16._28_4_ + fVar184;
      auVar21 = vsubps_avx(auVar59,auVar60);
      auVar15 = vminps_avx(auVar17,auVar23);
      auVar14 = vmaxps_avx(auVar17,auVar23);
      auVar16 = vminps_avx(auVar24,auVar83);
      auVar16 = vminps_avx(auVar15,auVar16);
      auVar15 = vmaxps_avx(auVar24,auVar83);
      auVar14 = vmaxps_avx(auVar14,auVar15);
      auVar17 = vminps_avx(auVar84,auVar85);
      auVar15 = vmaxps_avx(auVar84,auVar85);
      auVar18 = vminps_avx(auVar19,auVar21);
      auVar17 = vminps_avx(auVar17,auVar18);
      auVar17 = vminps_avx(auVar16,auVar17);
      auVar16 = vmaxps_avx(auVar19,auVar21);
      auVar15 = vmaxps_avx(auVar15,auVar16);
      auVar15 = vmaxps_avx(auVar14,auVar15);
      auVar14 = vcmpps_avx(auVar17,local_138,2);
      auVar15 = vcmpps_avx(auVar15,local_158,5);
      auVar14 = vandps_avx(auVar15,auVar14);
      auVar82 = vandps_avx(auVar82,local_1b8);
      auVar15 = auVar82 & auVar14;
      if ((((((((auVar15 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar15 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar15 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar15 >> 0x7f,0) != '\0') ||
            (auVar15 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar15 >> 0xbf,0) != '\0') ||
          (auVar15 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar15[0x1f] < '\0') {
        auVar82 = vandps_avx(auVar14,auVar82);
        uVar68 = vmovmskps_avx(auVar82);
      }
    }
    if (uVar68 != 0) {
      auStack_278[uVar72] = uVar68;
      uVar3 = vmovlps_avx(local_1f8);
      *(undefined8 *)(afStack_198 + uVar72 * 2) = uVar3;
      uVar4 = vmovlps_avx(local_498);
      auStack_58[uVar72] = uVar4;
      uVar72 = (ulong)((int)uVar72 + 1);
    }
    auVar319 = ZEXT864(0) << 0x20;
    auVar329 = ZEXT1664(CONCAT412(0x3f800000,CONCAT48(0x3f800000,&DAT_3f8000003f800000)));
    _local_418 = auVar20;
    do {
      if ((int)uVar72 == 0) {
        if ((uVar73 & 1) != 0) {
          return local_4d9;
        }
        fVar184 = ray->tfar;
        auVar90._4_4_ = fVar184;
        auVar90._0_4_ = fVar184;
        auVar90._8_4_ = fVar184;
        auVar90._12_4_ = fVar184;
        auVar90._16_4_ = fVar184;
        auVar90._20_4_ = fVar184;
        auVar90._24_4_ = fVar184;
        auVar90._28_4_ = fVar184;
        auVar82 = vcmpps_avx(local_178,auVar90,2);
        uVar68 = vmovmskps_avx(auVar82);
        uVar68 = (uint)uVar74 & uVar68;
        local_4d9 = uVar68 != 0;
        if (!local_4d9) {
          return local_4d9;
        }
        goto LAB_0110b16a;
      }
      uVar69 = (int)uVar72 - 1;
      uVar70 = (ulong)uVar69;
      uVar68 = auStack_278[uVar70];
      fVar184 = afStack_198[uVar70 * 2];
      fVar200 = afStack_198[uVar70 * 2 + 1];
      local_498._8_8_ = 0;
      local_498._0_8_ = auStack_58[uVar70];
      uVar4 = 0;
      if (uVar68 != 0) {
        for (; (uVar68 >> uVar4 & 1) == 0; uVar4 = uVar4 + 1) {
        }
      }
      uVar68 = uVar68 - 1 & uVar68;
      auStack_278[uVar70] = uVar68;
      if (uVar68 == 0) {
        uVar72 = (ulong)uVar69;
      }
      fVar202 = (float)(uVar4 + 1) * 0.14285715;
      fVar201 = (1.0 - (float)uVar4 * 0.14285715) * fVar184 + fVar200 * (float)uVar4 * 0.14285715;
      fVar184 = (1.0 - fVar202) * fVar184 + fVar200 * fVar202;
      fVar200 = fVar184 - fVar201;
      local_3f8 = ZEXT432((uint)fVar201);
      auVar241 = ZEXT416((uint)fVar201);
      _local_3d8 = ZEXT416((uint)fVar184);
      auVar101 = ZEXT416((uint)fVar201);
      if (0.16666667 <= fVar200) break;
      auVar101 = vshufps_avx(local_498,local_498,0x50);
      auVar22 = vsubps_avx(auVar329._0_16_,auVar101);
      fVar202 = auVar101._0_4_;
      fVar203 = auVar101._4_4_;
      fVar204 = auVar101._8_4_;
      fVar205 = auVar101._12_4_;
      fVar130 = auVar22._0_4_;
      fVar152 = auVar22._4_4_;
      fVar154 = auVar22._8_4_;
      fVar156 = auVar22._12_4_;
      auVar134._0_4_ = (float)local_318._0_4_ * fVar202 + fVar130 * fVar158;
      auVar134._4_4_ = (float)local_318._4_4_ * fVar203 + fVar152 * fVar160;
      auVar134._8_4_ = fStack_310 * fVar204 + fVar154 * fVar158;
      auVar134._12_4_ = fStack_30c * fVar205 + fVar156 * fVar160;
      auVar165._0_4_ = (float)local_328._0_4_ * fVar202 + fVar159 * fVar130;
      auVar165._4_4_ = (float)local_328._4_4_ * fVar203 + fVar176 * fVar152;
      auVar165._8_4_ = fStack_320 * fVar204 + fVar159 * fVar154;
      auVar165._12_4_ = fStack_31c * fVar205 + fVar176 * fVar156;
      auVar190._0_4_ = (float)local_338._0_4_ * fVar202 + auVar322._0_4_ * fVar130;
      auVar190._4_4_ = (float)local_338._4_4_ * fVar203 + auVar322._4_4_ * fVar152;
      auVar190._8_4_ = fStack_330 * fVar204 + auVar322._0_4_ * fVar154;
      auVar190._12_4_ = fStack_32c * fVar205 + auVar322._4_4_ * fVar156;
      auVar97._0_4_ = (float)local_348._0_4_ * fVar202 + fVar130 * auVar95._0_4_;
      auVar97._4_4_ = (float)local_348._4_4_ * fVar203 + fVar152 * auVar95._4_4_;
      auVar97._8_4_ = fStack_340 * fVar204 + fVar154 * auVar95._0_4_;
      auVar97._12_4_ = fStack_33c * fVar205 + fVar156 * auVar95._4_4_;
      auVar127._16_16_ = auVar134;
      auVar127._0_16_ = auVar134;
      auVar149._16_16_ = auVar165;
      auVar149._0_16_ = auVar165;
      auVar175._16_16_ = auVar190;
      auVar175._0_16_ = auVar190;
      auVar82 = vshufps_avx(ZEXT2032(CONCAT416(fVar184,ZEXT416((uint)fVar201))),
                            ZEXT2032(CONCAT416(fVar184,ZEXT416((uint)fVar201))),0);
      auVar14 = vsubps_avx(auVar149,auVar127);
      fVar202 = auVar82._0_4_;
      fVar203 = auVar82._4_4_;
      fVar204 = auVar82._8_4_;
      fVar205 = auVar82._12_4_;
      fVar130 = auVar82._16_4_;
      fVar152 = auVar82._20_4_;
      fVar154 = auVar82._24_4_;
      auVar128._0_4_ = auVar134._0_4_ + auVar14._0_4_ * fVar202;
      auVar128._4_4_ = auVar134._4_4_ + auVar14._4_4_ * fVar203;
      auVar128._8_4_ = auVar134._8_4_ + auVar14._8_4_ * fVar204;
      auVar128._12_4_ = auVar134._12_4_ + auVar14._12_4_ * fVar205;
      auVar128._16_4_ = auVar134._0_4_ + auVar14._16_4_ * fVar130;
      auVar128._20_4_ = auVar134._4_4_ + auVar14._20_4_ * fVar152;
      auVar128._24_4_ = auVar134._8_4_ + auVar14._24_4_ * fVar154;
      auVar128._28_4_ = auVar134._12_4_ + auVar14._28_4_;
      auVar14 = vsubps_avx(auVar175,auVar149);
      auVar150._0_4_ = auVar165._0_4_ + auVar14._0_4_ * fVar202;
      auVar150._4_4_ = auVar165._4_4_ + auVar14._4_4_ * fVar203;
      auVar150._8_4_ = auVar165._8_4_ + auVar14._8_4_ * fVar204;
      auVar150._12_4_ = auVar165._12_4_ + auVar14._12_4_ * fVar205;
      auVar150._16_4_ = auVar165._0_4_ + auVar14._16_4_ * fVar130;
      auVar150._20_4_ = auVar165._4_4_ + auVar14._20_4_ * fVar152;
      auVar150._24_4_ = auVar165._8_4_ + auVar14._24_4_ * fVar154;
      auVar150._28_4_ = auVar165._12_4_ + auVar14._28_4_;
      auVar101 = vsubps_avx(auVar97,auVar190);
      auVar113._0_4_ = auVar190._0_4_ + auVar101._0_4_ * fVar202;
      auVar113._4_4_ = auVar190._4_4_ + auVar101._4_4_ * fVar203;
      auVar113._8_4_ = auVar190._8_4_ + auVar101._8_4_ * fVar204;
      auVar113._12_4_ = auVar190._12_4_ + auVar101._12_4_ * fVar205;
      auVar113._16_4_ = auVar190._0_4_ + auVar101._0_4_ * fVar130;
      auVar113._20_4_ = auVar190._4_4_ + auVar101._4_4_ * fVar152;
      auVar113._24_4_ = auVar190._8_4_ + auVar101._8_4_ * fVar154;
      auVar113._28_4_ = auVar190._12_4_ + auVar101._12_4_;
      auVar14 = vsubps_avx(auVar150,auVar128);
      auVar129._0_4_ = auVar128._0_4_ + fVar202 * auVar14._0_4_;
      auVar129._4_4_ = auVar128._4_4_ + fVar203 * auVar14._4_4_;
      auVar129._8_4_ = auVar128._8_4_ + fVar204 * auVar14._8_4_;
      auVar129._12_4_ = auVar128._12_4_ + fVar205 * auVar14._12_4_;
      auVar129._16_4_ = auVar128._16_4_ + fVar130 * auVar14._16_4_;
      auVar129._20_4_ = auVar128._20_4_ + fVar152 * auVar14._20_4_;
      auVar129._24_4_ = auVar128._24_4_ + fVar154 * auVar14._24_4_;
      auVar129._28_4_ = auVar128._28_4_ + auVar14._28_4_;
      auVar14 = vsubps_avx(auVar113,auVar150);
      auVar114._0_4_ = auVar150._0_4_ + fVar202 * auVar14._0_4_;
      auVar114._4_4_ = auVar150._4_4_ + fVar203 * auVar14._4_4_;
      auVar114._8_4_ = auVar150._8_4_ + fVar204 * auVar14._8_4_;
      auVar114._12_4_ = auVar150._12_4_ + fVar205 * auVar14._12_4_;
      auVar114._16_4_ = auVar150._16_4_ + fVar130 * auVar14._16_4_;
      auVar114._20_4_ = auVar150._20_4_ + fVar152 * auVar14._20_4_;
      auVar114._24_4_ = auVar150._24_4_ + fVar154 * auVar14._24_4_;
      auVar114._28_4_ = auVar150._28_4_ + auVar14._28_4_;
      auVar14 = vsubps_avx(auVar114,auVar129);
      auVar135._0_4_ = auVar129._0_4_ + fVar202 * auVar14._0_4_;
      auVar135._4_4_ = auVar129._4_4_ + fVar203 * auVar14._4_4_;
      auVar135._8_4_ = auVar129._8_4_ + fVar204 * auVar14._8_4_;
      auVar135._12_4_ = auVar129._12_4_ + fVar205 * auVar14._12_4_;
      auVar151._16_4_ = auVar129._16_4_ + fVar130 * auVar14._16_4_;
      auVar151._0_16_ = auVar135;
      auVar151._20_4_ = auVar129._20_4_ + fVar152 * auVar14._20_4_;
      auVar151._24_4_ = auVar129._24_4_ + fVar154 * auVar14._24_4_;
      auVar151._28_4_ = auVar129._28_4_ + auVar150._28_4_;
      fVar202 = auVar14._4_4_ * 3.0;
      auVar117 = auVar151._16_16_;
      auVar100 = vshufps_avx(ZEXT416((uint)(fVar200 * 0.33333334)),
                             ZEXT416((uint)(fVar200 * 0.33333334)),0);
      auVar257._0_4_ = auVar135._0_4_ + auVar100._0_4_ * auVar14._0_4_ * 3.0;
      auVar257._4_4_ = auVar135._4_4_ + auVar100._4_4_ * fVar202;
      auVar257._8_4_ = auVar135._8_4_ + auVar100._8_4_ * auVar14._8_4_ * 3.0;
      auVar257._12_4_ = auVar135._12_4_ + auVar100._12_4_ * auVar14._12_4_ * 3.0;
      auVar197 = vshufpd_avx(auVar135,auVar135,3);
      auVar140 = vshufpd_avx(auVar117,auVar117,3);
      _local_308 = auVar197;
      auVar15 = _local_308;
      auVar101 = vsubps_avx(auVar197,auVar135);
      _local_478 = auVar140;
      auVar22 = vsubps_avx(auVar140,auVar117);
      auVar98._0_4_ = auVar101._0_4_ + auVar22._0_4_;
      auVar98._4_4_ = auVar101._4_4_ + auVar22._4_4_;
      auVar98._8_4_ = auVar101._8_4_ + auVar22._8_4_;
      auVar98._12_4_ = auVar101._12_4_ + auVar22._12_4_;
      auVar101 = vmovshdup_avx(auVar135);
      auVar22 = vmovshdup_avx(auVar257);
      auVar139 = vshufps_avx(auVar98,auVar98,0);
      auVar80 = vshufps_avx(auVar98,auVar98,0x55);
      fVar152 = auVar80._0_4_;
      fVar154 = auVar80._4_4_;
      fVar156 = auVar80._8_4_;
      fVar157 = auVar80._12_4_;
      fVar203 = auVar139._0_4_;
      fVar204 = auVar139._4_4_;
      fVar205 = auVar139._8_4_;
      fVar130 = auVar139._12_4_;
      auVar244._0_4_ = fVar203 * auVar135._0_4_ + fVar152 * auVar101._0_4_;
      auVar244._4_4_ = fVar204 * auVar135._4_4_ + fVar154 * auVar101._4_4_;
      auVar244._8_4_ = fVar205 * auVar135._8_4_ + fVar156 * auVar101._8_4_;
      auVar244._12_4_ = fVar130 * auVar135._12_4_ + fVar157 * auVar101._12_4_;
      _local_418 = auVar257;
      auVar258._0_4_ = auVar257._0_4_ * fVar203 + fVar152 * auVar22._0_4_;
      auVar258._4_4_ = auVar257._4_4_ * fVar204 + fVar154 * auVar22._4_4_;
      auVar258._8_4_ = auVar257._8_4_ * fVar205 + fVar156 * auVar22._8_4_;
      auVar258._12_4_ = auVar257._12_4_ * fVar130 + fVar157 * auVar22._12_4_;
      auVar22 = vshufps_avx(auVar244,auVar244,0xe8);
      auVar139 = vshufps_avx(auVar258,auVar258,0xe8);
      auVar101 = vcmpps_avx(auVar22,auVar139,1);
      uVar68 = vextractps_avx(auVar101,0);
      auVar80 = auVar258;
      if ((uVar68 & 1) == 0) {
        auVar80 = auVar244;
      }
      auVar99._0_4_ = auVar100._0_4_ * auVar14._16_4_ * 3.0;
      auVar99._4_4_ = auVar100._4_4_ * fVar202;
      auVar99._8_4_ = auVar100._8_4_ * auVar14._24_4_ * 3.0;
      auVar99._12_4_ = auVar100._12_4_ * auVar82._28_4_;
      auVar7 = vsubps_avx(auVar117,auVar99);
      auVar100 = vmovshdup_avx(auVar7);
      auVar117 = vmovshdup_avx(auVar117);
      fVar202 = auVar7._0_4_;
      fVar178 = auVar7._4_4_;
      auVar324._0_4_ = fVar203 * fVar202 + fVar152 * auVar100._0_4_;
      auVar324._4_4_ = fVar204 * fVar178 + fVar154 * auVar100._4_4_;
      auVar324._8_4_ = fVar205 * auVar7._8_4_ + fVar156 * auVar100._8_4_;
      auVar324._12_4_ = fVar130 * auVar7._12_4_ + fVar157 * auVar100._12_4_;
      auVar309._0_4_ = fVar203 * auVar151._16_4_ + fVar152 * auVar117._0_4_;
      auVar309._4_4_ = fVar204 * auVar151._20_4_ + fVar154 * auVar117._4_4_;
      auVar309._8_4_ = fVar205 * auVar151._24_4_ + fVar156 * auVar117._8_4_;
      auVar309._12_4_ = fVar130 * auVar151._28_4_ + fVar157 * auVar117._12_4_;
      auVar117 = vshufps_avx(auVar324,auVar324,0xe8);
      auVar6 = vshufps_avx(auVar309,auVar309,0xe8);
      auVar100 = vcmpps_avx(auVar117,auVar6,1);
      uVar68 = vextractps_avx(auVar100,0);
      auVar228 = auVar309;
      if ((uVar68 & 1) == 0) {
        auVar228 = auVar324;
      }
      auVar80 = vmaxss_avx(auVar228,auVar80);
      auVar22 = vminps_avx(auVar22,auVar139);
      auVar139 = vminps_avx(auVar117,auVar6);
      auVar139 = vminps_avx(auVar22,auVar139);
      auVar101 = vshufps_avx(auVar101,auVar101,0x55);
      auVar101 = vblendps_avx(auVar101,auVar100,2);
      auVar100 = vpslld_avx(auVar101,0x1f);
      auVar101 = vshufpd_avx(auVar258,auVar258,1);
      auVar101 = vinsertps_avx(auVar101,auVar309,0x9c);
      auVar22 = vshufpd_avx(auVar244,auVar244,1);
      auVar22 = vinsertps_avx(auVar22,auVar324,0x9c);
      auVar101 = vblendvps_avx(auVar22,auVar101,auVar100);
      auVar22 = vmovshdup_avx(auVar101);
      auVar101 = vmaxss_avx(auVar22,auVar101);
      fVar205 = auVar139._0_4_;
      auVar22 = vmovshdup_avx(auVar139);
      fVar204 = auVar101._0_4_;
      fVar130 = auVar22._0_4_;
      fVar203 = auVar80._0_4_;
      _local_308 = auVar15;
      if ((0.0001 <= fVar205) || (fVar204 <= -0.0001)) {
        if ((-0.0001 < fVar203 && fVar130 < 0.0001) ||
           ((fVar205 < 0.0001 && -0.0001 < fVar203 || (fVar130 < 0.0001 && -0.0001 < fVar204))))
        goto LAB_0110c379;
LAB_0110cf71:
        bVar61 = true;
        auVar319 = ZEXT1664(ZEXT816(0) << 0x40);
        auVar329 = ZEXT1664(CONCAT412(0x3f800000,CONCAT48(0x3f800000,&DAT_3f8000003f800000)));
      }
      else {
LAB_0110c379:
        auVar319 = ZEXT864(0) << 0x20;
        auVar100 = vcmpps_avx(auVar139,ZEXT816(0) << 0x20,1);
        auVar22 = vcmpss_avx(auVar80,ZEXT416(0),1);
        auVar325._8_4_ = 0x3f800000;
        auVar325._0_8_ = &DAT_3f8000003f800000;
        auVar325._12_4_ = 0x3f800000;
        auVar329 = ZEXT1664(auVar325);
        auVar191._8_4_ = 0xbf800000;
        auVar191._0_8_ = 0xbf800000bf800000;
        auVar191._12_4_ = 0xbf800000;
        auVar22 = vblendvps_avx(auVar325,auVar191,auVar22);
        auVar100 = vblendvps_avx(auVar325,auVar191,auVar100);
        auVar117 = vcmpss_avx(auVar22,auVar100,4);
        auVar117 = vpshufd_avx(ZEXT416(auVar117._0_4_ & 1),0x50);
        auVar117 = vpslld_avx(auVar117,0x1f);
        auVar117 = vpsrad_avx(auVar117,0x1f);
        auVar117 = vpandn_avx(auVar117,_DAT_02020eb0);
        auVar6 = vmovshdup_avx(auVar100);
        fVar152 = auVar6._0_4_;
        if ((auVar100._0_4_ != fVar152) || (NAN(auVar100._0_4_) || NAN(fVar152))) {
          if ((fVar130 != fVar205) || (NAN(fVar130) || NAN(fVar205))) {
            fVar205 = -fVar205 / (fVar130 - fVar205);
            auVar100 = vmovsldup_avx(ZEXT416((uint)((1.0 - fVar205) * 0.0 + fVar205)));
          }
          else {
            auVar100 = vcmpss_avx(auVar139,ZEXT416(0),0);
            auVar100 = vpshufd_avx(ZEXT416(auVar100._0_4_ & 1),0x50);
            auVar100 = vpslld_avx(auVar100,0x1f);
            auVar100 = vblendvps_avx(ZEXT816(0xff8000007f800000),_DAT_01fec6f0,auVar100);
          }
          auVar6 = vcmpps_avx(auVar117,auVar100,1);
          auVar139 = vblendps_avx(auVar117,auVar100,2);
          auVar100 = vblendps_avx(auVar100,auVar117,2);
          auVar117 = vblendvps_avx(auVar100,auVar139,auVar6);
        }
        auVar101 = vcmpss_avx(auVar101,ZEXT416(0),1);
        auVar118._8_4_ = 0xbf800000;
        auVar118._0_8_ = 0xbf800000bf800000;
        auVar118._12_4_ = 0xbf800000;
        auVar101 = vblendvps_avx(auVar325,auVar118,auVar101);
        fVar205 = auVar101._0_4_;
        if ((auVar22._0_4_ != fVar205) || (NAN(auVar22._0_4_) || NAN(fVar205))) {
          if ((fVar204 != fVar203) || (NAN(fVar204) || NAN(fVar203))) {
            fVar203 = -fVar203 / (fVar204 - fVar203);
            auVar101 = vmovsldup_avx(ZEXT416((uint)((1.0 - fVar203) * 0.0 + fVar203)));
          }
          else {
            auVar101 = vcmpss_avx(auVar80,ZEXT416(0),0);
            auVar101 = vpshufd_avx(ZEXT416(auVar101._0_4_ & 1),0x50);
            auVar101 = vpslld_avx(auVar101,0x1f);
            auVar101 = vblendvps_avx(ZEXT816(0xff8000007f800000),_DAT_01fec6f0,auVar101);
          }
          auVar100 = vcmpps_avx(auVar117,auVar101,1);
          auVar22 = vblendps_avx(auVar117,auVar101,2);
          auVar101 = vblendps_avx(auVar101,auVar117,2);
          auVar117 = vblendvps_avx(auVar101,auVar22,auVar100);
        }
        if ((fVar152 != fVar205) || (NAN(fVar152) || NAN(fVar205))) {
          auVar101 = vcmpps_avx(auVar117,auVar325,1);
          auVar22 = vinsertps_avx(auVar117,SUB6416(ZEXT464(0x3f800000),0),0x10);
          auVar192._4_12_ = auVar117._4_12_;
          auVar192._0_4_ = 0x3f800000;
          auVar117 = vblendvps_avx(auVar192,auVar22,auVar101);
        }
        auVar101 = vcmpps_avx(auVar117,_DAT_01fec6f0,1);
        auVar62._12_4_ = 0;
        auVar62._0_12_ = auVar117._4_12_;
        auVar22 = vinsertps_avx(auVar117,ZEXT416(0x3f800000),0x10);
        auVar101 = vblendvps_avx(auVar22,auVar62 << 0x20,auVar101);
        auVar22 = vmovshdup_avx(auVar101);
        bVar61 = true;
        if (auVar101._0_4_ <= auVar22._0_4_) {
          auVar102._0_4_ = auVar101._0_4_ + -0.1;
          auVar102._4_4_ = auVar101._4_4_ + 0.1;
          auVar102._8_4_ = auVar101._8_4_ + 0.0;
          auVar102._12_4_ = auVar101._12_4_ + 0.0;
          auVar100 = vshufpd_avx(auVar257,auVar257,3);
          register0x000012c8 = 0x3f80000000000000;
          local_418 = 0x3f80000000000000;
          auVar101 = vcmpps_avx(auVar102,_local_418,1);
          auVar63._12_4_ = 0;
          auVar63._0_12_ = auVar102._4_12_;
          auVar22 = vinsertps_avx(auVar102,SUB6416(ZEXT464(0x3f800000),0),0x10);
          auVar101 = vblendvps_avx(auVar22,auVar63 << 0x20,auVar101);
          auVar22 = vshufpd_avx(auVar7,auVar7,3);
          auVar139 = vshufps_avx(auVar101,auVar101,0x50);
          auVar80 = vsubps_avx(auVar325,auVar139);
          local_308._0_4_ = auVar197._0_4_;
          local_308._4_4_ = auVar197._4_4_;
          fStack_300 = auVar197._8_4_;
          fStack_2fc = auVar197._12_4_;
          fVar203 = auVar139._0_4_;
          fVar204 = auVar139._4_4_;
          fVar205 = auVar139._8_4_;
          fVar130 = auVar139._12_4_;
          local_478._0_4_ = auVar140._0_4_;
          local_478._4_4_ = auVar140._4_4_;
          fStack_470 = auVar140._8_4_;
          fStack_46c = auVar140._12_4_;
          fVar152 = auVar80._0_4_;
          fVar154 = auVar80._4_4_;
          fVar156 = auVar80._8_4_;
          fVar157 = auVar80._12_4_;
          auVar119._0_4_ = fVar203 * (float)local_308._0_4_ + fVar152 * auVar135._0_4_;
          auVar119._4_4_ = fVar204 * (float)local_308._4_4_ + fVar154 * auVar135._4_4_;
          auVar119._8_4_ = fVar205 * fStack_300 + fVar156 * auVar135._0_4_;
          auVar119._12_4_ = fVar130 * fStack_2fc + fVar157 * auVar135._4_4_;
          auVar166._0_4_ = fVar203 * auVar100._0_4_ + fVar152 * auVar257._0_4_;
          auVar166._4_4_ = fVar204 * auVar100._4_4_ + fVar154 * auVar257._4_4_;
          auVar166._8_4_ = fVar205 * auVar100._8_4_ + fVar156 * auVar257._0_4_;
          auVar166._12_4_ = fVar130 * auVar100._12_4_ + fVar157 * auVar257._4_4_;
          auVar229._0_4_ = fVar203 * auVar22._0_4_ + fVar152 * fVar202;
          auVar229._4_4_ = fVar204 * auVar22._4_4_ + fVar154 * fVar178;
          auVar229._8_4_ = fVar205 * auVar22._8_4_ + fVar156 * fVar202;
          auVar229._12_4_ = fVar130 * auVar22._12_4_ + fVar157 * fVar178;
          auVar245._0_4_ = fVar203 * (float)local_478._0_4_ + fVar152 * auVar151._16_4_;
          auVar245._4_4_ = fVar204 * (float)local_478._4_4_ + fVar154 * auVar151._20_4_;
          auVar245._8_4_ = fVar205 * fStack_470 + fVar156 * auVar151._16_4_;
          auVar245._12_4_ = fVar130 * fStack_46c + fVar157 * auVar151._20_4_;
          auVar140 = vsubps_avx(auVar325,auVar101);
          auVar22 = vmovshdup_avx(local_498);
          auVar197 = vmovsldup_avx(local_498);
          local_498._0_4_ = auVar140._0_4_ * auVar197._0_4_ + auVar22._0_4_ * auVar101._0_4_;
          local_498._4_4_ = auVar140._4_4_ * auVar197._4_4_ + auVar22._4_4_ * auVar101._4_4_;
          local_498._8_4_ = auVar140._8_4_ * auVar197._8_4_ + auVar22._8_4_ * auVar101._8_4_;
          local_498._12_4_ = auVar140._12_4_ * auVar197._12_4_ + auVar22._12_4_ * auVar101._12_4_;
          _local_478 = vmovshdup_avx(local_498);
          auVar101 = vsubps_avx(auVar166,auVar119);
          auVar193._0_4_ = auVar101._0_4_ * 3.0;
          auVar193._4_4_ = auVar101._4_4_ * 3.0;
          auVar193._8_4_ = auVar101._8_4_ * 3.0;
          auVar193._12_4_ = auVar101._12_4_ * 3.0;
          auVar101 = vsubps_avx(auVar229,auVar166);
          auVar212._0_4_ = auVar101._0_4_ * 3.0;
          auVar212._4_4_ = auVar101._4_4_ * 3.0;
          auVar212._8_4_ = auVar101._8_4_ * 3.0;
          auVar212._12_4_ = auVar101._12_4_ * 3.0;
          auVar101 = vsubps_avx(auVar245,auVar229);
          auVar259._0_4_ = auVar101._0_4_ * 3.0;
          auVar259._4_4_ = auVar101._4_4_ * 3.0;
          auVar259._8_4_ = auVar101._8_4_ * 3.0;
          auVar259._12_4_ = auVar101._12_4_ * 3.0;
          auVar22 = vminps_avx(auVar212,auVar259);
          auVar101 = vmaxps_avx(auVar212,auVar259);
          auVar22 = vminps_avx(auVar193,auVar22);
          auVar101 = vmaxps_avx(auVar193,auVar101);
          auVar197 = vshufpd_avx(auVar22,auVar22,3);
          auVar140 = vshufpd_avx(auVar101,auVar101,3);
          auVar22 = vminps_avx(auVar22,auVar197);
          auVar101 = vmaxps_avx(auVar101,auVar140);
          auVar197 = vshufps_avx(ZEXT416((uint)(1.0 / fVar200)),ZEXT416((uint)(1.0 / fVar200)),0);
          auVar194._0_4_ = auVar197._0_4_ * auVar22._0_4_;
          auVar194._4_4_ = auVar197._4_4_ * auVar22._4_4_;
          auVar194._8_4_ = auVar197._8_4_ * auVar22._8_4_;
          auVar194._12_4_ = auVar197._12_4_ * auVar22._12_4_;
          auVar213._0_4_ = auVar101._0_4_ * auVar197._0_4_;
          auVar213._4_4_ = auVar101._4_4_ * auVar197._4_4_;
          auVar213._8_4_ = auVar101._8_4_ * auVar197._8_4_;
          auVar213._12_4_ = auVar101._12_4_ * auVar197._12_4_;
          auVar80 = ZEXT416((uint)(1.0 / (local_478._0_4_ - local_498._0_4_)));
          auVar101 = vshufpd_avx(auVar119,auVar119,3);
          auVar22 = vshufpd_avx(auVar166,auVar166,3);
          auVar197 = vshufpd_avx(auVar229,auVar229,3);
          auVar140 = vshufpd_avx(auVar245,auVar245,3);
          auVar101 = vsubps_avx(auVar101,auVar119);
          auVar100 = vsubps_avx(auVar22,auVar166);
          auVar139 = vsubps_avx(auVar197,auVar229);
          auVar140 = vsubps_avx(auVar140,auVar245);
          auVar22 = vminps_avx(auVar101,auVar100);
          auVar101 = vmaxps_avx(auVar101,auVar100);
          auVar197 = vminps_avx(auVar139,auVar140);
          auVar197 = vminps_avx(auVar22,auVar197);
          auVar22 = vmaxps_avx(auVar139,auVar140);
          auVar101 = vmaxps_avx(auVar101,auVar22);
          auVar22 = vshufps_avx(auVar80,auVar80,0);
          auVar272._0_4_ = auVar22._0_4_ * auVar197._0_4_;
          auVar272._4_4_ = auVar22._4_4_ * auVar197._4_4_;
          auVar272._8_4_ = auVar22._8_4_ * auVar197._8_4_;
          auVar272._12_4_ = auVar22._12_4_ * auVar197._12_4_;
          auVar280._0_4_ = auVar22._0_4_ * auVar101._0_4_;
          auVar280._4_4_ = auVar22._4_4_ * auVar101._4_4_;
          auVar280._8_4_ = auVar22._8_4_ * auVar101._8_4_;
          auVar280._12_4_ = auVar22._12_4_ * auVar101._12_4_;
          auVar101 = vmovsldup_avx(local_498);
          auVar230._4_12_ = auVar101._4_12_;
          auVar230._0_4_ = fVar201;
          auVar246._4_12_ = local_498._4_12_;
          auVar246._0_4_ = fVar184;
          auVar81._0_4_ = (fVar184 + fVar201) * 0.5;
          auVar81._4_4_ = (local_498._4_4_ + auVar101._4_4_) * 0.5;
          auVar81._8_4_ = (local_498._8_4_ + auVar101._8_4_) * 0.5;
          auVar81._12_4_ = (local_498._12_4_ + auVar101._12_4_) * 0.5;
          auVar101 = vshufps_avx(auVar81,auVar81,0);
          fVar202 = auVar101._0_4_;
          fVar203 = auVar101._4_4_;
          fVar204 = auVar101._8_4_;
          fVar205 = auVar101._12_4_;
          auVar167._0_4_ = fVar202 * (float)local_1c8._0_4_ + (float)local_2c8._0_4_;
          auVar167._4_4_ = fVar203 * (float)local_1c8._4_4_ + (float)local_2c8._4_4_;
          auVar167._8_4_ = fVar204 * fStack_1c0 + fStack_2c0;
          auVar167._12_4_ = fVar205 * fStack_1bc + fStack_2bc;
          auVar260._0_4_ = fVar202 * (float)local_1d8._0_4_ + (float)local_2d8._0_4_;
          auVar260._4_4_ = fVar203 * (float)local_1d8._4_4_ + (float)local_2d8._4_4_;
          auVar260._8_4_ = fVar204 * fStack_1d0 + fStack_2d0;
          auVar260._12_4_ = fVar205 * fStack_1cc + fStack_2cc;
          auVar296._0_4_ = fVar202 * (float)local_1e8._0_4_ + (float)local_2e8._0_4_;
          auVar296._4_4_ = fVar203 * (float)local_1e8._4_4_ + (float)local_2e8._4_4_;
          auVar296._8_4_ = fVar204 * fStack_1e0 + fStack_2e0;
          auVar296._12_4_ = fVar205 * fStack_1dc + fStack_2dc;
          auVar101 = vsubps_avx(auVar260,auVar167);
          auVar168._0_4_ = auVar101._0_4_ * fVar202 + auVar167._0_4_;
          auVar168._4_4_ = auVar101._4_4_ * fVar203 + auVar167._4_4_;
          auVar168._8_4_ = auVar101._8_4_ * fVar204 + auVar167._8_4_;
          auVar168._12_4_ = auVar101._12_4_ * fVar205 + auVar167._12_4_;
          auVar101 = vsubps_avx(auVar296,auVar260);
          auVar261._0_4_ = auVar260._0_4_ + auVar101._0_4_ * fVar202;
          auVar261._4_4_ = auVar260._4_4_ + auVar101._4_4_ * fVar203;
          auVar261._8_4_ = auVar260._8_4_ + auVar101._8_4_ * fVar204;
          auVar261._12_4_ = auVar260._12_4_ + auVar101._12_4_ * fVar205;
          auVar101 = vsubps_avx(auVar261,auVar168);
          fVar202 = auVar168._0_4_ + auVar101._0_4_ * fVar202;
          fVar203 = auVar168._4_4_ + auVar101._4_4_ * fVar203;
          auVar120._0_8_ = CONCAT44(fVar203,fVar202);
          auVar120._8_4_ = auVar168._8_4_ + auVar101._8_4_ * fVar204;
          auVar120._12_4_ = auVar168._12_4_ + auVar101._12_4_ * fVar205;
          fVar204 = auVar101._0_4_ * 3.0;
          fVar205 = auVar101._4_4_ * 3.0;
          auVar169._0_8_ = CONCAT44(fVar205,fVar204);
          auVar169._8_4_ = auVar101._8_4_ * 3.0;
          auVar169._12_4_ = auVar101._12_4_ * 3.0;
          auVar262._8_8_ = auVar120._0_8_;
          auVar262._0_8_ = auVar120._0_8_;
          auVar101 = vshufpd_avx(auVar120,auVar120,3);
          auVar22 = vshufps_avx(auVar81,auVar81,0x55);
          auVar139 = vsubps_avx(auVar101,auVar262);
          auVar263._0_4_ = auVar22._0_4_ * auVar139._0_4_ + fVar202;
          auVar263._4_4_ = auVar22._4_4_ * auVar139._4_4_ + fVar203;
          auVar263._8_4_ = auVar22._8_4_ * auVar139._8_4_ + fVar202;
          auVar263._12_4_ = auVar22._12_4_ * auVar139._12_4_ + fVar203;
          auVar310._8_8_ = auVar169._0_8_;
          auVar310._0_8_ = auVar169._0_8_;
          auVar101 = vshufpd_avx(auVar169,auVar169,1);
          auVar101 = vsubps_avx(auVar101,auVar310);
          auVar170._0_4_ = fVar204 + auVar22._0_4_ * auVar101._0_4_;
          auVar170._4_4_ = fVar205 + auVar22._4_4_ * auVar101._4_4_;
          auVar170._8_4_ = fVar204 + auVar22._8_4_ * auVar101._8_4_;
          auVar170._12_4_ = fVar205 + auVar22._12_4_ * auVar101._12_4_;
          auVar22 = vmovshdup_avx(auVar170);
          auVar311._0_8_ = auVar22._0_8_ ^ 0x8000000080000000;
          auVar311._8_4_ = auVar22._8_4_ ^ 0x80000000;
          auVar311._12_4_ = auVar22._12_4_ ^ 0x80000000;
          auVar197 = vmovshdup_avx(auVar139);
          auVar101 = vunpcklps_avx(auVar197,auVar311);
          auVar140 = vshufps_avx(auVar101,auVar311,4);
          auVar121._0_8_ = auVar139._0_8_ ^ 0x8000000080000000;
          auVar121._8_4_ = -auVar139._8_4_;
          auVar121._12_4_ = -auVar139._12_4_;
          auVar101 = vmovlhps_avx(auVar121,auVar170);
          auVar100 = vshufps_avx(auVar101,auVar170,8);
          auVar101 = ZEXT416((uint)(auVar197._0_4_ * auVar170._0_4_ - auVar22._0_4_ * auVar139._0_4_
                                   ));
          auVar22 = vshufps_avx(auVar101,auVar101,0);
          auVar101 = vdivps_avx(auVar140,auVar22);
          auVar22 = vdivps_avx(auVar100,auVar22);
          auVar100 = vinsertps_avx(auVar194,auVar272,0x1c);
          auVar139 = vinsertps_avx(auVar213,auVar280,0x1c);
          auVar80 = vinsertps_avx(auVar272,auVar194,0x4c);
          auVar117 = vinsertps_avx(auVar280,auVar213,0x4c);
          auVar197 = vmovsldup_avx(auVar101);
          auVar281._0_4_ = auVar197._0_4_ * auVar100._0_4_;
          auVar281._4_4_ = auVar197._4_4_ * auVar100._4_4_;
          auVar281._8_4_ = auVar197._8_4_ * auVar100._8_4_;
          auVar281._12_4_ = auVar197._12_4_ * auVar100._12_4_;
          auVar273._0_4_ = auVar197._0_4_ * auVar139._0_4_;
          auVar273._4_4_ = auVar197._4_4_ * auVar139._4_4_;
          auVar273._8_4_ = auVar197._8_4_ * auVar139._8_4_;
          auVar273._12_4_ = auVar197._12_4_ * auVar139._12_4_;
          auVar140 = vminps_avx(auVar281,auVar273);
          auVar197 = vmaxps_avx(auVar273,auVar281);
          auVar6 = vmovsldup_avx(auVar22);
          auVar326._0_4_ = auVar6._0_4_ * auVar80._0_4_;
          auVar326._4_4_ = auVar6._4_4_ * auVar80._4_4_;
          auVar326._8_4_ = auVar6._8_4_ * auVar80._8_4_;
          auVar326._12_4_ = auVar6._12_4_ * auVar80._12_4_;
          auVar274._0_4_ = auVar6._0_4_ * auVar117._0_4_;
          auVar274._4_4_ = auVar6._4_4_ * auVar117._4_4_;
          auVar274._8_4_ = auVar6._8_4_ * auVar117._8_4_;
          auVar274._12_4_ = auVar6._12_4_ * auVar117._12_4_;
          auVar6 = vminps_avx(auVar326,auVar274);
          auVar103._0_4_ = auVar140._0_4_ + auVar6._0_4_;
          auVar103._4_4_ = auVar140._4_4_ + auVar6._4_4_;
          auVar103._8_4_ = auVar140._8_4_ + auVar6._8_4_;
          auVar103._12_4_ = auVar140._12_4_ + auVar6._12_4_;
          auVar140 = vmaxps_avx(auVar274,auVar326);
          auVar6 = vsubps_avx(auVar230,auVar81);
          auVar7 = vsubps_avx(auVar246,auVar81);
          auVar247._0_4_ = auVar197._0_4_ + auVar140._0_4_;
          auVar247._4_4_ = auVar197._4_4_ + auVar140._4_4_;
          auVar247._8_4_ = auVar197._8_4_ + auVar140._8_4_;
          auVar247._12_4_ = auVar197._12_4_ + auVar140._12_4_;
          auVar282._8_8_ = 0x3f800000;
          auVar282._0_8_ = 0x3f800000;
          auVar197 = vsubps_avx(auVar282,auVar247);
          auVar140 = vsubps_avx(auVar282,auVar103);
          fVar154 = auVar6._0_4_;
          auVar283._0_4_ = fVar154 * auVar197._0_4_;
          fVar156 = auVar6._4_4_;
          auVar283._4_4_ = fVar156 * auVar197._4_4_;
          fVar157 = auVar6._8_4_;
          auVar283._8_4_ = fVar157 * auVar197._8_4_;
          fVar178 = auVar6._12_4_;
          auVar283._12_4_ = fVar178 * auVar197._12_4_;
          fVar204 = auVar7._0_4_;
          auVar248._0_4_ = auVar197._0_4_ * fVar204;
          fVar205 = auVar7._4_4_;
          auVar248._4_4_ = auVar197._4_4_ * fVar205;
          fVar130 = auVar7._8_4_;
          auVar248._8_4_ = auVar197._8_4_ * fVar130;
          fVar152 = auVar7._12_4_;
          auVar248._12_4_ = auVar197._12_4_ * fVar152;
          auVar317._0_4_ = fVar154 * auVar140._0_4_;
          auVar317._4_4_ = fVar156 * auVar140._4_4_;
          auVar317._8_4_ = fVar157 * auVar140._8_4_;
          auVar317._12_4_ = fVar178 * auVar140._12_4_;
          auVar104._0_4_ = fVar204 * auVar140._0_4_;
          auVar104._4_4_ = fVar205 * auVar140._4_4_;
          auVar104._8_4_ = fVar130 * auVar140._8_4_;
          auVar104._12_4_ = fVar152 * auVar140._12_4_;
          auVar197 = vminps_avx(auVar283,auVar317);
          auVar140 = vminps_avx(auVar248,auVar104);
          auVar6 = vminps_avx(auVar197,auVar140);
          auVar197 = vmaxps_avx(auVar317,auVar283);
          auVar140 = vmaxps_avx(auVar104,auVar248);
          auVar7 = vshufps_avx(auVar81,auVar81,0x54);
          auVar140 = vmaxps_avx(auVar140,auVar197);
          auVar228 = vshufps_avx(auVar263,auVar263,0);
          auVar75 = vshufps_avx(auVar263,auVar263,0x55);
          auVar197 = vhaddps_avx(auVar6,auVar6);
          auVar140 = vhaddps_avx(auVar140,auVar140);
          auVar249._0_4_ = auVar228._0_4_ * auVar101._0_4_ + auVar75._0_4_ * auVar22._0_4_;
          auVar249._4_4_ = auVar228._4_4_ * auVar101._4_4_ + auVar75._4_4_ * auVar22._4_4_;
          auVar249._8_4_ = auVar228._8_4_ * auVar101._8_4_ + auVar75._8_4_ * auVar22._8_4_;
          auVar249._12_4_ = auVar228._12_4_ * auVar101._12_4_ + auVar75._12_4_ * auVar22._12_4_;
          auVar6 = vsubps_avx(auVar7,auVar249);
          fVar202 = auVar6._0_4_ + auVar197._0_4_;
          fVar203 = auVar6._0_4_ + auVar140._0_4_;
          auVar197 = vmaxss_avx(ZEXT416((uint)fVar201),ZEXT416((uint)fVar202));
          auVar140 = vminss_avx(ZEXT416((uint)fVar203),ZEXT416((uint)fVar184));
          if (auVar197._0_4_ <= auVar140._0_4_) {
            auVar197 = vmovshdup_avx(auVar101);
            auVar136._0_4_ = auVar100._0_4_ * auVar197._0_4_;
            auVar136._4_4_ = auVar100._4_4_ * auVar197._4_4_;
            auVar136._8_4_ = auVar100._8_4_ * auVar197._8_4_;
            auVar136._12_4_ = auVar100._12_4_ * auVar197._12_4_;
            auVar105._0_4_ = auVar139._0_4_ * auVar197._0_4_;
            auVar105._4_4_ = auVar139._4_4_ * auVar197._4_4_;
            auVar105._8_4_ = auVar139._8_4_ * auVar197._8_4_;
            auVar105._12_4_ = auVar139._12_4_ * auVar197._12_4_;
            auVar140 = vminps_avx(auVar136,auVar105);
            auVar197 = vmaxps_avx(auVar105,auVar136);
            auVar100 = vmovshdup_avx(auVar22);
            auVar195._0_4_ = auVar100._0_4_ * auVar80._0_4_;
            auVar195._4_4_ = auVar100._4_4_ * auVar80._4_4_;
            auVar195._8_4_ = auVar100._8_4_ * auVar80._8_4_;
            auVar195._12_4_ = auVar100._12_4_ * auVar80._12_4_;
            auVar137._0_4_ = auVar100._0_4_ * auVar117._0_4_;
            auVar137._4_4_ = auVar100._4_4_ * auVar117._4_4_;
            auVar137._8_4_ = auVar100._8_4_ * auVar117._8_4_;
            auVar137._12_4_ = auVar100._12_4_ * auVar117._12_4_;
            auVar100 = vminps_avx(auVar195,auVar137);
            auVar214._0_4_ = auVar140._0_4_ + auVar100._0_4_;
            auVar214._4_4_ = auVar140._4_4_ + auVar100._4_4_;
            auVar214._8_4_ = auVar140._8_4_ + auVar100._8_4_;
            auVar214._12_4_ = auVar140._12_4_ + auVar100._12_4_;
            auVar140 = vmaxps_avx(auVar137,auVar195);
            auVar106._0_4_ = auVar197._0_4_ + auVar140._0_4_;
            auVar106._4_4_ = auVar197._4_4_ + auVar140._4_4_;
            auVar106._8_4_ = auVar197._8_4_ + auVar140._8_4_;
            auVar106._12_4_ = auVar197._12_4_ + auVar140._12_4_;
            auVar197 = vsubps_avx(_local_418,auVar106);
            auVar140 = vsubps_avx(_local_418,auVar214);
            auVar196._0_4_ = fVar154 * auVar197._0_4_;
            auVar196._4_4_ = fVar156 * auVar197._4_4_;
            auVar196._8_4_ = fVar157 * auVar197._8_4_;
            auVar196._12_4_ = fVar178 * auVar197._12_4_;
            auVar215._0_4_ = fVar154 * auVar140._0_4_;
            auVar215._4_4_ = fVar156 * auVar140._4_4_;
            auVar215._8_4_ = fVar157 * auVar140._8_4_;
            auVar215._12_4_ = fVar178 * auVar140._12_4_;
            auVar107._0_4_ = fVar204 * auVar197._0_4_;
            auVar107._4_4_ = fVar205 * auVar197._4_4_;
            auVar107._8_4_ = fVar130 * auVar197._8_4_;
            auVar107._12_4_ = fVar152 * auVar197._12_4_;
            auVar138._0_4_ = fVar204 * auVar140._0_4_;
            auVar138._4_4_ = fVar205 * auVar140._4_4_;
            auVar138._8_4_ = fVar130 * auVar140._8_4_;
            auVar138._12_4_ = fVar152 * auVar140._12_4_;
            auVar197 = vminps_avx(auVar196,auVar215);
            auVar140 = vminps_avx(auVar107,auVar138);
            auVar197 = vminps_avx(auVar197,auVar140);
            auVar140 = vmaxps_avx(auVar215,auVar196);
            auVar100 = vmaxps_avx(auVar138,auVar107);
            auVar197 = vhaddps_avx(auVar197,auVar197);
            auVar140 = vmaxps_avx(auVar100,auVar140);
            auVar140 = vhaddps_avx(auVar140,auVar140);
            auVar100 = vmovshdup_avx(auVar6);
            auVar139 = ZEXT416((uint)(auVar100._0_4_ + auVar197._0_4_));
            auVar197 = vmaxss_avx(local_498,auVar139);
            auVar100 = ZEXT416((uint)(auVar100._0_4_ + auVar140._0_4_));
            auVar140 = vminss_avx(auVar100,_local_478);
            if (auVar197._0_4_ <= auVar140._0_4_) {
              uVar68 = 0;
              auVar319 = ZEXT864(0) << 0x20;
              auVar327._8_4_ = 0x3f800000;
              auVar327._0_8_ = &DAT_3f8000003f800000;
              auVar327._12_4_ = 0x3f800000;
              auVar329 = ZEXT1664(auVar327);
              if (fVar202 <= fVar201) {
                auVar250._8_4_ = 0x7fffffff;
                auVar250._0_8_ = 0x7fffffff7fffffff;
                auVar250._12_4_ = 0x7fffffff;
              }
              else {
                auVar250._8_4_ = 0x7fffffff;
                auVar250._0_8_ = 0x7fffffff7fffffff;
                auVar250._12_4_ = 0x7fffffff;
                if (fVar203 < fVar184) {
                  auVar197 = vcmpps_avx(auVar100,_local_478,1);
                  auVar140 = vcmpps_avx(local_498,auVar139,1);
                  auVar197 = vandps_avx(auVar140,auVar197);
                  uVar68 = auVar197._0_4_;
                }
              }
              if (((uint)uVar72 < 4 && 0.001 <= fVar200) && (uVar68 & 1) == 0) {
                bVar61 = false;
              }
              else {
                lVar71 = 200;
                do {
                  fVar200 = auVar6._0_4_;
                  fVar184 = 1.0 - fVar200;
                  auVar197 = ZEXT416((uint)(fVar184 * fVar184 * fVar184));
                  auVar197 = vshufps_avx(auVar197,auVar197,0);
                  auVar140 = ZEXT416((uint)(fVar200 * 3.0 * fVar184 * fVar184));
                  auVar140 = vshufps_avx(auVar140,auVar140,0);
                  auVar100 = ZEXT416((uint)(fVar184 * fVar200 * fVar200 * 3.0));
                  auVar100 = vshufps_avx(auVar100,auVar100,0);
                  auVar139 = ZEXT416((uint)(fVar200 * fVar200 * fVar200));
                  auVar139 = vshufps_avx(auVar139,auVar139,0);
                  fVar184 = (float)local_2c8._0_4_ * auVar197._0_4_ +
                            (float)local_2d8._0_4_ * auVar140._0_4_ +
                            auVar139._0_4_ * (float)local_448._0_4_ +
                            (float)local_2e8._0_4_ * auVar100._0_4_;
                  fVar200 = (float)local_2c8._4_4_ * auVar197._4_4_ +
                            (float)local_2d8._4_4_ * auVar140._4_4_ +
                            auVar139._4_4_ * (float)local_448._4_4_ +
                            (float)local_2e8._4_4_ * auVar100._4_4_;
                  auVar108._0_8_ = CONCAT44(fVar200,fVar184);
                  auVar108._8_4_ =
                       fStack_2c0 * auVar197._8_4_ +
                       fStack_2d0 * auVar140._8_4_ +
                       auVar139._8_4_ * fStack_440 + fStack_2e0 * auVar100._8_4_;
                  auVar108._12_4_ =
                       fStack_2bc * auVar197._12_4_ +
                       fStack_2cc * auVar140._12_4_ +
                       auVar139._12_4_ * fStack_43c + fStack_2dc * auVar100._12_4_;
                  auVar141._8_8_ = auVar108._0_8_;
                  auVar141._0_8_ = auVar108._0_8_;
                  auVar140 = vshufpd_avx(auVar108,auVar108,1);
                  auVar197 = vmovshdup_avx(auVar6);
                  auVar140 = vsubps_avx(auVar140,auVar141);
                  auVar109._0_4_ = auVar197._0_4_ * auVar140._0_4_ + fVar184;
                  auVar109._4_4_ = auVar197._4_4_ * auVar140._4_4_ + fVar200;
                  auVar109._8_4_ = auVar197._8_4_ * auVar140._8_4_ + fVar184;
                  auVar109._12_4_ = auVar197._12_4_ * auVar140._12_4_ + fVar200;
                  auVar197 = vshufps_avx(auVar109,auVar109,0);
                  auVar140 = vshufps_avx(auVar109,auVar109,0x55);
                  auVar142._0_4_ = auVar101._0_4_ * auVar197._0_4_ + auVar22._0_4_ * auVar140._0_4_;
                  auVar142._4_4_ = auVar101._4_4_ * auVar197._4_4_ + auVar22._4_4_ * auVar140._4_4_;
                  auVar142._8_4_ = auVar101._8_4_ * auVar197._8_4_ + auVar22._8_4_ * auVar140._8_4_;
                  auVar142._12_4_ =
                       auVar101._12_4_ * auVar197._12_4_ + auVar22._12_4_ * auVar140._12_4_;
                  auVar6 = vsubps_avx(auVar6,auVar142);
                  auVar197 = vandps_avx(auVar250,auVar109);
                  auVar140 = vshufps_avx(auVar197,auVar197,0xf5);
                  auVar197 = vmaxss_avx(auVar140,auVar197);
                  if (auVar197._0_4_ < (float)local_458._0_4_) {
                    fVar184 = auVar6._0_4_;
                    if ((0.0 <= fVar184) && (fVar184 <= 1.0)) {
                      auVar101 = vmovshdup_avx(auVar6);
                      fVar200 = auVar101._0_4_;
                      if ((0.0 <= fVar200) && (fVar200 <= 1.0)) {
                        auVar101 = vinsertps_avx(ZEXT416((uint)(pre->ray_space).vx.field_0.m128[2]),
                                                 ZEXT416((uint)(pre->ray_space).vy.field_0.m128[2]),
                                                 0x1c);
                        auVar117 = vinsertps_avx(auVar101,ZEXT416((uint)(pre->ray_space).vz.field_0.
                                                                        m128[2]),0x28);
                        aVar5 = (ray->org).field_0;
                        auVar101 = vsubps_avx(_local_358,(undefined1  [16])aVar5);
                        auVar101 = vdpps_avx(auVar101,auVar117,0x7f);
                        auVar22 = vsubps_avx(_local_388,(undefined1  [16])aVar5);
                        auVar22 = vdpps_avx(auVar22,auVar117,0x7f);
                        auVar197 = vsubps_avx(_local_398,(undefined1  [16])aVar5);
                        auVar197 = vdpps_avx(auVar197,auVar117,0x7f);
                        auVar140 = vsubps_avx(_local_378,(undefined1  [16])aVar5);
                        auVar140 = vdpps_avx(auVar140,auVar117,0x7f);
                        auVar100 = vsubps_avx(_local_368,(undefined1  [16])aVar5);
                        auVar100 = vdpps_avx(auVar100,auVar117,0x7f);
                        auVar139 = vsubps_avx(_local_3a8,(undefined1  [16])aVar5);
                        auVar139 = vdpps_avx(auVar139,auVar117,0x7f);
                        auVar80 = vsubps_avx(_local_3b8,(undefined1  [16])aVar5);
                        auVar80 = vdpps_avx(auVar80,auVar117,0x7f);
                        auVar66._4_4_ = fStack_424;
                        auVar66._0_4_ = local_428;
                        auVar66._8_4_ = fStack_420;
                        auVar66._12_4_ = fStack_41c;
                        auVar7 = vsubps_avx(auVar66,(undefined1  [16])aVar5);
                        auVar117 = vdpps_avx(auVar7,auVar117,0x7f);
                        fVar130 = 1.0 - fVar200;
                        fVar152 = 1.0 - fVar184;
                        fVar202 = auVar6._4_4_;
                        fVar203 = auVar6._8_4_;
                        fVar204 = auVar6._12_4_;
                        fVar205 = fVar152 * fVar184 * fVar184 * 3.0;
                        auVar198._0_4_ = fVar184 * fVar184 * fVar184;
                        auVar198._4_4_ = fVar202 * fVar202 * fVar202;
                        auVar198._8_4_ = fVar203 * fVar203 * fVar203;
                        auVar198._12_4_ = fVar204 * fVar204 * fVar204;
                        fVar202 = fVar184 * 3.0 * fVar152 * fVar152;
                        fVar203 = fVar152 * fVar152 * fVar152;
                        fVar184 = (fVar130 * auVar101._0_4_ + auVar100._0_4_ * fVar200) * fVar203 +
                                  fVar202 * (auVar139._0_4_ * fVar200 + fVar130 * auVar22._0_4_) +
                                  fVar205 * (auVar80._0_4_ * fVar200 + fVar130 * auVar197._0_4_) +
                                  auVar198._0_4_ *
                                  (fVar130 * auVar140._0_4_ + fVar200 * auVar117._0_4_);
                        if (((ray->org).field_0.m128[3] <= fVar184) && (fVar184 <= ray->tfar)) {
                          pGVar9 = (context->scene->geometries).items[local_430].ptr;
                          auVar101 = ZEXT416((uint)fVar201);
                          if ((pGVar9->mask & ray->mask) == 0) {
                            bVar67 = 0;
                          }
                          else if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                                  (bVar67 = 1, pGVar9->occlusionFilterN != (RTCFilterFunctionN)0x0))
                          {
                            local_478._0_4_ = ray->tfar;
                            auVar101 = vshufps_avx(auVar6,auVar6,0x55);
                            auVar241 = vsubps_avx(auVar327,auVar101);
                            fVar200 = auVar101._0_4_;
                            fVar201 = auVar101._4_4_;
                            fVar204 = auVar101._8_4_;
                            fVar130 = auVar101._12_4_;
                            fVar154 = auVar241._0_4_;
                            fVar156 = auVar241._4_4_;
                            fVar157 = auVar241._8_4_;
                            fVar178 = auVar241._12_4_;
                            auVar264._0_4_ =
                                 fVar200 * (float)local_368._0_4_ + fVar154 * (float)local_358._0_4_
                            ;
                            auVar264._4_4_ =
                                 fVar201 * (float)local_368._4_4_ + fVar156 * (float)local_358._4_4_
                            ;
                            auVar264._8_4_ = fVar204 * fStack_360 + fVar157 * fStack_350;
                            auVar264._12_4_ = fVar130 * fStack_35c + fVar178 * fStack_34c;
                            auVar275._0_4_ =
                                 fVar200 * (float)local_3a8._0_4_ + fVar154 * (float)local_388._0_4_
                            ;
                            auVar275._4_4_ =
                                 fVar201 * (float)local_3a8._4_4_ + fVar156 * (float)local_388._4_4_
                            ;
                            auVar275._8_4_ = fVar204 * fStack_3a0 + fVar157 * fStack_380;
                            auVar275._12_4_ = fVar130 * fStack_39c + fVar178 * fStack_37c;
                            auVar284._0_4_ =
                                 fVar200 * (float)local_3b8._0_4_ + fVar154 * (float)local_398._0_4_
                            ;
                            auVar284._4_4_ =
                                 fVar201 * (float)local_3b8._4_4_ + fVar156 * (float)local_398._4_4_
                            ;
                            auVar284._8_4_ = fVar204 * fStack_3b0 + fVar157 * fStack_390;
                            auVar284._12_4_ = fVar130 * fStack_3ac + fVar178 * fStack_38c;
                            auVar231._0_4_ = fVar154 * (float)local_378._0_4_ + fVar200 * local_428;
                            auVar231._4_4_ = fVar156 * (float)local_378._4_4_ + fVar201 * fStack_424
                            ;
                            auVar231._8_4_ = fVar157 * fStack_370 + fVar204 * fStack_420;
                            auVar231._12_4_ = fVar178 * fStack_36c + fVar130 * fStack_41c;
                            auVar197 = vsubps_avx(auVar275,auVar264);
                            auVar140 = vsubps_avx(auVar284,auVar275);
                            auVar100 = vsubps_avx(auVar231,auVar284);
                            auVar101 = vshufps_avx(auVar6,auVar6,0);
                            fVar154 = auVar101._0_4_;
                            fVar156 = auVar101._4_4_;
                            fVar157 = auVar101._8_4_;
                            fVar178 = auVar101._12_4_;
                            auVar101 = vshufps_avx(ZEXT416((uint)fVar152),ZEXT416((uint)fVar152),0);
                            fVar200 = auVar101._0_4_;
                            fVar201 = auVar101._4_4_;
                            fVar204 = auVar101._8_4_;
                            fVar130 = auVar101._12_4_;
                            auVar101 = vshufps_avx(auVar198,auVar198,0);
                            auVar241 = vshufps_avx(ZEXT416((uint)fVar205),ZEXT416((uint)fVar205),0);
                            auVar22 = vshufps_avx(ZEXT416((uint)fVar202),ZEXT416((uint)fVar202),0);
                            auVar171._0_4_ =
                                 ((auVar197._0_4_ * fVar200 + fVar154 * auVar140._0_4_) * fVar200 +
                                 fVar154 * (auVar140._0_4_ * fVar200 + fVar154 * auVar100._0_4_)) *
                                 3.0;
                            auVar171._4_4_ =
                                 ((auVar197._4_4_ * fVar201 + fVar156 * auVar140._4_4_) * fVar201 +
                                 fVar156 * (auVar140._4_4_ * fVar201 + fVar156 * auVar100._4_4_)) *
                                 3.0;
                            auVar171._8_4_ =
                                 ((auVar197._8_4_ * fVar204 + fVar157 * auVar140._8_4_) * fVar204 +
                                 fVar157 * (auVar140._8_4_ * fVar204 + fVar157 * auVar100._8_4_)) *
                                 3.0;
                            auVar171._12_4_ =
                                 ((auVar197._12_4_ * fVar130 + fVar178 * auVar140._12_4_) * fVar130
                                 + fVar178 * (auVar140._12_4_ * fVar130 + fVar178 * auVar100._12_4_)
                                 ) * 3.0;
                            auVar197 = vshufps_avx(ZEXT416((uint)fVar203),ZEXT416((uint)fVar203),0);
                            auVar122._0_4_ =
                                 auVar197._0_4_ * (float)local_208._0_4_ +
                                 auVar22._0_4_ * (float)local_218._0_4_ +
                                 auVar101._0_4_ * (float)local_238._0_4_ +
                                 auVar241._0_4_ * (float)local_228._0_4_;
                            auVar122._4_4_ =
                                 auVar197._4_4_ * (float)local_208._4_4_ +
                                 auVar22._4_4_ * (float)local_218._4_4_ +
                                 auVar101._4_4_ * (float)local_238._4_4_ +
                                 auVar241._4_4_ * (float)local_228._4_4_;
                            auVar122._8_4_ =
                                 auVar197._8_4_ * fStack_200 +
                                 auVar22._8_4_ * fStack_210 +
                                 auVar101._8_4_ * fStack_230 + auVar241._8_4_ * fStack_220;
                            auVar122._12_4_ =
                                 auVar197._12_4_ * fStack_1fc +
                                 auVar22._12_4_ * fStack_20c +
                                 auVar101._12_4_ * fStack_22c + auVar241._12_4_ * fStack_21c;
                            auVar101 = vshufps_avx(auVar171,auVar171,0xc9);
                            auVar143._0_4_ = auVar122._0_4_ * auVar101._0_4_;
                            auVar143._4_4_ = auVar122._4_4_ * auVar101._4_4_;
                            auVar143._8_4_ = auVar122._8_4_ * auVar101._8_4_;
                            auVar143._12_4_ = auVar122._12_4_ * auVar101._12_4_;
                            auVar101 = vshufps_avx(auVar122,auVar122,0xc9);
                            auVar123._0_4_ = auVar171._0_4_ * auVar101._0_4_;
                            auVar123._4_4_ = auVar171._4_4_ * auVar101._4_4_;
                            auVar123._8_4_ = auVar171._8_4_ * auVar101._8_4_;
                            auVar123._12_4_ = auVar171._12_4_ * auVar101._12_4_;
                            auVar241 = vsubps_avx(auVar123,auVar143);
                            auVar101 = vshufps_avx(auVar241,auVar241,0xe9);
                            local_268 = vmovlps_avx(auVar101);
                            local_260 = auVar241._0_4_;
                            local_25c = vmovlps_avx(auVar6);
                            local_254 = (int)local_2b8;
                            local_250 = (int)local_430;
                            local_24c = context->user->instID[0];
                            local_248 = context->user->instPrimID[0];
                            ray->tfar = fVar184;
                            local_47c = -1;
                            local_2a8.valid = &local_47c;
                            local_2a8.geometryUserPtr = pGVar9->userPtr;
                            local_2a8.context = context->user;
                            local_2a8.hit = (RTCHitN *)&local_268;
                            local_2a8.N = 1;
                            local_2a8.ray = (RTCRayN *)ray;
                            if (pGVar9->occlusionFilterN == (RTCFilterFunctionN)0x0) {
LAB_0110cec9:
                              p_Var10 = context->args->filter;
                              fVar184 = (float)local_478._0_4_;
                              if (p_Var10 != (RTCFilterFunctionN)0x0) {
                                if (((context->args->flags &
                                     RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                                     RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                                   (((pGVar9->field_8).field_0x2 & 0x40) != 0)) {
                                  (*p_Var10)(&local_2a8);
                                  auVar329 = ZEXT1664(CONCAT412(0x3f800000,
                                                                CONCAT48(0x3f800000,
                                                                         &DAT_3f8000003f800000)));
                                  auVar319 = ZEXT1664(ZEXT816(0) << 0x40);
                                }
                                fVar184 = (float)local_478._0_4_;
                                if (*local_2a8.valid == 0) {
                                  bVar67 = 0;
                                  goto LAB_0110cfb0;
                                }
                              }
                              bVar67 = 1;
                            }
                            else {
                              stack0xfffffffffffffcfc = auVar15._4_28_;
                              local_308._0_4_ = (int)uVar73;
                              (*pGVar9->occlusionFilterN)(&local_2a8);
                              uVar73 = (ulong)(uint)local_308._0_4_;
                              auVar329 = ZEXT1664(CONCAT412(0x3f800000,
                                                            CONCAT48(0x3f800000,
                                                                     &DAT_3f8000003f800000)));
                              auVar319 = ZEXT1664(ZEXT816(0) << 0x40);
                              if (*local_2a8.valid != 0) goto LAB_0110cec9;
                              bVar67 = 0;
                              fVar184 = (float)local_478._0_4_;
                            }
LAB_0110cfb0:
                            auVar101 = local_3f8._0_16_;
                            if (bVar67 == 0) {
                              ray->tfar = fVar184;
                            }
                          }
                          local_3f8._0_16_ = auVar101;
                          uVar73 = CONCAT71((int7)(uVar73 >> 8),(byte)uVar73 | bVar67);
                          auVar241 = local_3f8._0_16_;
                        }
                      }
                    }
                    break;
                  }
                  lVar71 = lVar71 + -1;
                } while (lVar71 != 0);
              }
              goto LAB_0110cc4f;
            }
          }
          goto LAB_0110cf71;
        }
      }
LAB_0110cc4f:
      local_3f8._0_16_ = auVar241;
      auVar101 = local_3f8._0_16_;
    } while (bVar61);
    local_3f8._0_16_ = auVar101;
    local_1f8 = vinsertps_avx(local_3f8._0_16_,ZEXT416((uint)local_3d8._0_4_),0x10);
  } while( true );
}

Assistant:

static __forceinline bool occluded_n(const Precalculations& pre, Ray& ray, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);

          unsigned int vertexID = geom->curve(primID);
          Vec3ff a0,a1,a2,a3; Vec3fa n0,n1,n2,n3; geom->gather(a0,a1,a2,a3,n0,n1,n2,n3,vertexID);

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }

          if (Intersector().intersect(pre,ray,context,geom,primID,a0,a1,a2,a3,n0,n1,n2,n3,Epilog(ray,context,geomID,primID)))
            return true;
          
          mask &= movemask(tNear <= vfloat<M>(ray.tfar));
        }
        return false;
      }